

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager_test.cpp
# Opt level: O3

void __thiscall
JobManagerTestSuite_BuildFinalResultString_Test::TestBody
          (JobManagerTestSuite_BuildFinalResultString_Test *this)

{
  FunctionMocker<bool_()> *pFVar1;
  FunctionMocker<void_()> *pFVar2;
  _Manager_type *pp_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  JobManager *pJVar5;
  pointer *ppuVar6;
  undefined1 uVar7;
  void *pvVar8;
  undefined8 uVar9;
  pointer puVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  value_t vVar12;
  json_value jVar13;
  undefined **ppuVar14;
  element_type *peVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  element_type *peVar17;
  bool bVar18;
  int iVar19;
  CommissionerAppMock *pCVar20;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *pTVar21;
  TypedExpectation<bool_()> *pTVar22;
  ActionInterface<bool_()> *pAVar23;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pTVar24;
  reference pvVar25;
  TypedExpectation<ot::commissioner::Error_(unsigned_short_&)> *pTVar26;
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *pTVar27;
  TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> *pTVar28;
  long lVar29;
  char *pcVar30;
  char *pcVar31;
  _func_int **pp_Var32;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<testing::Action<void_(unsigned_short_&)>_> __l_06;
  initializer_list<testing::Action<void_(unsigned_short_&)>_> __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>
  __l_10;
  initializer_list<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<unsigned_long> __l_13;
  initializer_list<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_> __l_14;
  initializer_list<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_> __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<unsigned_long> __l_17;
  undefined1 local_b98 [16];
  undefined1 local_b88 [16];
  Action<void_(ot::commissioner::ActiveOperationalDataset_&)> converted_2;
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  SecurityPolicy policies [2];
  Status local_ada;
  Status local_ad9;
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [24];
  internal local_ab0;
  undefined7 uStack_aaf;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_aa8;
  NetworkId nid;
  ByteArray local_a98;
  _Any_data local_a78;
  undefined1 local_a68 [16];
  json json;
  string local_a40;
  uint8_t camIdx;
  BorderRouterId rid;
  bool ret;
  undefined6 uStack_a16;
  undefined **ppuStack_a10;
  undefined1 local_a08 [8];
  undefined1 local_a00 [8];
  undefined **ppuStack_9f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9f0;
  undefined1 local_9e0 [8];
  undefined *local_9d8;
  undefined1 local_9d0 [24];
  undefined1 *local_9b8 [2];
  undefined1 local_9a8 [16];
  _Alloc_hider local_998 [2];
  char local_988 [248];
  undefined8 uStack_890;
  CommissionerAppMockPtr commissionerAppMocks [3];
  State local_84c;
  State local_848;
  State local_844;
  Value value;
  _func_int **local_6c8;
  UnixTime local_6b0;
  UnixTime local_6a8;
  UnixTime local_6a0;
  undefined1 local_698 [8];
  json_value local_690;
  undefined1 local_688 [8];
  json_value local_680;
  undefined1 local_678 [8];
  json_value local_670;
  undefined1 local_668 [8];
  json_value local_660;
  undefined1 local_658 [8];
  json_value local_650;
  _Any_data local_648;
  code *local_638;
  undefined8 uStack_630;
  _Any_data local_628;
  code *local_618;
  undefined8 uStack_610;
  _Any_data local_608;
  code *local_5f8;
  undefined8 uStack_5f0;
  _Any_data local_5e8;
  code *local_5d8;
  undefined8 uStack_5d0;
  _Any_data local_5c8;
  code *local_5b8;
  undefined8 uStack_5b0;
  _Any_data local_5a8;
  code *local_598;
  undefined8 uStack_590;
  undefined1 local_588 [8];
  _Alloc_hider local_580;
  char local_570 [16];
  Error local_560;
  Error local_538;
  Error local_510;
  Error local_4e8;
  Error local_4c0;
  Error local_498;
  Error local_470;
  Error local_448;
  Error local_420;
  TestContext ctx;
  
  JobManagerTestSuite::TestContext::TestContext(&ctx);
  JobManagerTestSuite::SetInitialExpectations(&this->super_JobManagerTestSuite,&ctx);
  _ret = 0x3031;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&ctx.mConf.mPSKc);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&nid);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&rid);
  peVar17 = ctx.mPS.
            super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&converted_2,0);
  ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)local_b98,0);
  value.mError._0_8_ = &value.mError.mMessage._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&value,"pan1","");
  policies[0]._0_8_ =
       &policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_finish;
  pp_Var32 = (_func_int **)0x26a8b5;
  std::__cxx11::string::_M_construct<char_const*>((string *)policies,"","");
  ot::commissioner::persistent_storage::Network::Network
            ((Network *)&ret,(NetworkId *)&converted_2,(DomainId *)local_b98,(string *)&value,1,1,1,
             (string *)policies,0);
  iVar19 = (*(peVar17->super_PersistentStorage)._vptr_PersistentStorage[6])(peVar17,&ret,&nid);
  local_b48[0] = (char)iVar19;
  local_ad8._0_8_ = local_ad8._0_8_ & 0xffffffffffffff00;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
            ((internal *)commissionerAppMocks,
             "ctx.mPS->Add(Network{0, 0, \"pan1\", 1, 1, 0x1, \"\", 0}, nid)",
             "PersistentStorage::Status::kSuccess",local_b48,local_ad8);
  if (local_9e0 != (undefined1  [8])local_9d0) {
    operator_delete((void *)local_9e0);
  }
  if (ppuStack_a10 != (undefined **)local_a00) {
    operator_delete(ppuStack_a10);
  }
  if ((pointer *)policies[0]._0_8_ !=
      &policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)policies[0]._0_8_);
  }
  if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
    operator_delete((void *)value.mError._0_8_);
  }
  _Var16._M_pi = commissionerAppMocks[0].
                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
  if ((char)commissionerAppMocks[0].
            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr == '\0') {
    testing::Message::Message((Message *)&ret);
    if (commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var32 = (commissionerAppMocks[0].
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
               ,0x238,(char *)pp_Var32);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&ret);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*_ret + 8))();
    }
    if (commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00137f02;
    local_aa8 = commissionerAppMocks[0].
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        (commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_vptr__Sp_counted_base !=
        commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1) {
      operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (commissionerAppMocks[0].
                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_vptr__Sp_counted_base);
    }
  }
  else {
    if (commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          (commissionerAppMocks[0].
           super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base !=
          commissionerAppMocks[0].
          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1)
      {
        operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (commissionerAppMocks[0].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base);
      }
      operator_delete(_Var16._M_pi);
    }
    value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&ret,"nid.mId","0",&nid.mId,(int *)&value);
    if (ret == false) {
      testing::Message::Message((Message *)&value);
      if (ppuStack_a10 == (undefined **)0x0) {
        pcVar30 = "";
      }
      else {
        pcVar30 = *ppuStack_a10;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)policies,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0x239,pcVar30);
      testing::internal::AssertHelper::operator=((AssertHelper *)policies,(Message *)&value);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
      if (value.mError._0_8_ != 0) {
        (**(code **)(*(long *)value.mError._0_8_ + 8))();
      }
    }
    ppuVar14 = ppuStack_a10;
    if (ppuStack_a10 != (undefined **)0x0) {
      if (*ppuStack_a10 != (pointer)((long)ppuStack_a10 + 0x10)) {
        operator_delete(*ppuStack_a10);
      }
      operator_delete(ppuVar14);
    }
    peVar17 = ctx.mPS.
              super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId
              ((BorderRouterId *)&camIdx,0);
    policies[0]._0_8_ =
         &policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>((string *)policies,"127.0.0.1","");
    local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(commissionerAppMocks + 1);
    std::__cxx11::string::_M_construct<char_const*>((string *)commissionerAppMocks,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_844,0,0,0,0,0);
    converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
         &converted_2.fun_.super__Function_base._M_manager;
    std::__cxx11::string::_M_construct<char_const*>((string *)&converted_2,"");
    local_b98._0_8_ = local_b88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b98,"");
    local_b48._0_8_ = local_b38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b48,"");
    local_ad8._0_8_ = local_ac8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ad8,"");
    json.m_type = null;
    json._1_7_ = 0;
    json.m_value.object = (object_t *)0x0;
    local_a78._M_unused._M_object = local_a68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a78,"");
    local_a40._M_dataplus._M_p = (pointer)&local_a40.field_2;
    pp_Var32 = (_func_int **)0x26a8b5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a40,"","");
    ot::commissioner::UnixTime::UnixTime(&local_6a0,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&value,(string *)policies,0x4e21,&local_a98,
               (string *)commissionerAppMocks,local_844,(string *)&converted_2,0,(string *)local_b98
               ,(string *)local_b48,(Timestamp)0x0,0,(string *)local_ad8,(ByteArray *)&json,
               (string *)&local_a78,'\0',0,&local_a40,local_6a0,0xf);
    ot::commissioner::persistent_storage::BorderRouter::BorderRouter
              ((BorderRouter *)&ret,(BorderRouterId *)&camIdx,&nid,(BorderAgent *)&value);
    iVar19 = (*(peVar17->super_PersistentStorage)._vptr_PersistentStorage[7])(peVar17,&ret,&rid);
    local_ad9 = (Status)iVar19;
    local_ada = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
              (&local_ab0,
               "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
               ,"PersistentStorage::Status::kSuccess",&local_ad9,&local_ada);
    _ret = &PTR__BorderRouter_002dacd8;
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_a08);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
      operator_delete(local_a40._M_dataplus._M_p);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a78._M_unused._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a68) {
      operator_delete(local_a78._M_unused._M_object);
    }
    if (json._0_8_ != 0) {
      operator_delete((void *)json._0_8_);
    }
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         *)local_ad8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         *)local_ac8) {
      operator_delete((void *)local_ad8._0_8_);
    }
    if ((undefined1 *)local_b48._0_8_ != local_b38) {
      operator_delete((void *)local_b48._0_8_);
    }
    if ((undefined1 *)local_b98._0_8_ != local_b88) {
      operator_delete((void *)local_b98._0_8_);
    }
    if ((_Manager_type *)converted_2.fun_.super__Function_base._M_functor._M_unused._0_8_ !=
        &converted_2.fun_.super__Function_base._M_manager) {
      operator_delete(converted_2.fun_.super__Function_base._M_functor._M_unused._M_object);
    }
    if (commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)(commissionerAppMocks + 1)) {
      operator_delete(commissionerAppMocks[0].
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer *)policies[0]._0_8_ !=
        &policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish) {
      operator_delete((void *)policies[0]._0_8_);
    }
    p_Var11 = local_aa8;
    if (local_ab0 == (internal)0x0) {
      testing::Message::Message((Message *)&ret);
      if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pp_Var32 = local_aa8->_vptr__Sp_counted_base;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0x240,(char *)pp_Var32);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&ret);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )_ret != (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     )0x0) {
        (**(code **)(*_ret + 8))();
      }
      if (local_aa8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00137f02;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_aa8->_vptr__Sp_counted_base !=
          local_aa8 + 1) {
        operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_aa8->_vptr__Sp_counted_base);
      }
    }
    else {
      if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_aa8->_vptr__Sp_counted_base !=
            local_aa8 + 1) {
          operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_aa8->_vptr__Sp_counted_base);
        }
        operator_delete(p_Var11);
      }
      value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)&ret,"rid.mId","0",&rid.mId,(int *)&value);
      if (ret == false) {
        testing::Message::Message((Message *)&value);
        if (ppuStack_a10 == (undefined **)0x0) {
          pcVar30 = "";
        }
        else {
          pcVar30 = *ppuStack_a10;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)policies,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                   ,0x241,pcVar30);
        testing::internal::AssertHelper::operator=((AssertHelper *)policies,(Message *)&value);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
        if (value.mError._0_8_ != 0) {
          (**(code **)(*(long *)value.mError._0_8_ + 8))();
        }
      }
      ppuVar14 = ppuStack_a10;
      if (ppuStack_a10 != (undefined **)0x0) {
        if (*ppuStack_a10 != (pointer)((long)ppuStack_a10 + 0x10)) {
          operator_delete(*ppuStack_a10);
        }
        operator_delete(ppuVar14);
      }
      peVar17 = ctx.mPS.
                super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&converted_2,0);
      ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)local_b98,0);
      value.mError._0_8_ = &value.mError.mMessage._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&value,"pan2","");
      policies[0]._0_8_ =
           &policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish;
      pp_Var32 = (_func_int **)0x26a8b5;
      std::__cxx11::string::_M_construct<char_const*>((string *)policies,"","");
      ot::commissioner::persistent_storage::Network::Network
                ((Network *)&ret,(NetworkId *)&converted_2,(DomainId *)local_b98,(string *)&value,2,
                 2,2,(string *)policies,0);
      iVar19 = (*(peVar17->super_PersistentStorage)._vptr_PersistentStorage[6])(peVar17,&ret,&nid);
      local_b48[0] = (char)iVar19;
      local_ad8._0_8_ = local_ad8._0_8_ & 0xffffffffffffff00;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                ((internal *)commissionerAppMocks,
                 "ctx.mPS->Add(Network{0, 0, \"pan2\", 2, 2, 0x2, \"\", 0}, nid)",
                 "PersistentStorage::Status::kSuccess",local_b48,local_ad8);
      if (local_9e0 != (undefined1  [8])local_9d0) {
        operator_delete((void *)local_9e0);
      }
      if (ppuStack_a10 != (undefined **)local_a00) {
        operator_delete(ppuStack_a10);
      }
      if ((pointer *)policies[0]._0_8_ !=
          &policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)policies[0]._0_8_);
      }
      if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
        operator_delete((void *)value.mError._0_8_);
      }
      _Var16._M_pi = commissionerAppMocks[0].
                     super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi;
      if ((char)commissionerAppMocks[0].
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr == '\0')
      {
        testing::Message::Message((Message *)&ret);
        if (commissionerAppMocks[0].
            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pp_Var32 = (commissionerAppMocks[0].
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_vptr__Sp_counted_base;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&value,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                   ,0x243,(char *)pp_Var32);
        testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&ret);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )_ret != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           ) {
          (**(code **)(*_ret + 8))();
        }
        if (commissionerAppMocks[0].
            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00137f02;
        local_aa8 = commissionerAppMocks[0].
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (commissionerAppMocks[0].
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_vptr__Sp_counted_base !=
            commissionerAppMocks[0].
            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
            1) {
          operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          (commissionerAppMocks[0].
                           super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base);
        }
      }
      else {
        if (commissionerAppMocks[0].
            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (commissionerAppMocks[0].
               super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_vptr__Sp_counted_base !=
              commissionerAppMocks[0].
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              + 1) {
            operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (commissionerAppMocks[0].
                             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base);
          }
          operator_delete(_Var16._M_pi);
        }
        value.mError.mCode = kCancelled;
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  ((internal *)&ret,"nid.mId","1",&nid.mId,(int *)&value);
        if (ret == false) {
          testing::Message::Message((Message *)&value);
          if (ppuStack_a10 == (undefined **)0x0) {
            pcVar30 = "";
          }
          else {
            pcVar30 = *ppuStack_a10;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)policies,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                     ,0x244,pcVar30);
          testing::internal::AssertHelper::operator=((AssertHelper *)policies,(Message *)&value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
          if (value.mError._0_8_ != 0) {
            (**(code **)(*(long *)value.mError._0_8_ + 8))();
          }
        }
        ppuVar14 = ppuStack_a10;
        if (ppuStack_a10 != (undefined **)0x0) {
          if (*ppuStack_a10 != (pointer)((long)ppuStack_a10 + 0x10)) {
            operator_delete(*ppuStack_a10);
          }
          operator_delete(ppuVar14);
        }
        peVar17 = ctx.mPS.
                  super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId
                  ((BorderRouterId *)&camIdx,0);
        policies[0]._0_8_ =
             &policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char_const*>((string *)policies,"127.0.0.1","");
        local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)(commissionerAppMocks + 1);
        std::__cxx11::string::_M_construct<char_const*>((string *)commissionerAppMocks,"1.1","");
        ot::commissioner::BorderAgent::State::State(&local_848,0,0,0,0,0);
        converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
             &converted_2.fun_.super__Function_base._M_manager;
        std::__cxx11::string::_M_construct<char_const*>((string *)&converted_2,"");
        local_b98._0_8_ = local_b88;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b98,"");
        local_b48._0_8_ = local_b38;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b48,"");
        local_ad8._0_8_ = local_ac8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_ad8,"");
        json.m_type = null;
        json._1_7_ = 0;
        json.m_value.object = (object_t *)0x0;
        local_a78._M_unused._M_object = local_a68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a78,"");
        local_a40._M_dataplus._M_p = (pointer)&local_a40.field_2;
        local_6c8 = (_func_int **)0x26a8b5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a40);
        ot::commissioner::UnixTime::UnixTime(&local_6a8,0);
        ot::commissioner::BorderAgent::BorderAgent
                  ((BorderAgent *)&value,(string *)policies,0x4e22,&local_a98,
                   (string *)commissionerAppMocks,local_848,(string *)&converted_2,0,
                   (string *)local_b98,(string *)local_b48,(Timestamp)0x0,0,(string *)local_ad8,
                   (ByteArray *)&json,(string *)&local_a78,'\0',0,&local_a40,local_6a8,0xf);
        ot::commissioner::persistent_storage::BorderRouter::BorderRouter
                  ((BorderRouter *)&ret,(BorderRouterId *)&camIdx,&nid,(BorderAgent *)&value);
        iVar19 = (*(peVar17->super_PersistentStorage)._vptr_PersistentStorage[7])(peVar17,&ret,&rid)
        ;
        local_ad9 = (Status)iVar19;
        local_ada = kSuccess;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                  (&local_ab0,
                   "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
                   ,"PersistentStorage::Status::kSuccess",&local_ad9,&local_ada);
        _ret = &PTR__BorderRouter_002dacd8;
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_a08);
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
          operator_delete(local_a40._M_dataplus._M_p);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a78._M_unused._0_8_ !=
            (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a68) {
          operator_delete(local_a78._M_unused._M_object);
        }
        if (json._0_8_ != 0) {
          operator_delete((void *)json._0_8_);
        }
        if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             *)local_ad8._0_8_ !=
            (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             *)local_ac8) {
          operator_delete((void *)local_ad8._0_8_);
        }
        if ((undefined1 *)local_b48._0_8_ != local_b38) {
          operator_delete((void *)local_b48._0_8_);
        }
        if ((undefined1 *)local_b98._0_8_ != local_b88) {
          operator_delete((void *)local_b98._0_8_);
        }
        if ((_Manager_type *)converted_2.fun_.super__Function_base._M_functor._M_unused._0_8_ !=
            &converted_2.fun_.super__Function_base._M_manager) {
          operator_delete(converted_2.fun_.super__Function_base._M_functor._M_unused._M_object);
        }
        if (commissionerAppMocks[0].
            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)(commissionerAppMocks + 1)) {
          operator_delete(commissionerAppMocks[0].
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         );
        }
        if (local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a98.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((pointer *)policies[0]._0_8_ !=
            &policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)policies[0]._0_8_);
        }
        p_Var11 = local_aa8;
        if (local_ab0 == (internal)0x0) {
          testing::Message::Message((Message *)&ret);
          if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_6c8 = local_aa8->_vptr__Sp_counted_base;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&value,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                     ,0x24b,(char *)local_6c8);
          testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&ret);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
          if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )_ret != (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         )0x0) {
            (**(code **)(*_ret + 8))();
          }
          if (local_aa8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00137f02;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_aa8->_vptr__Sp_counted_base !=
              local_aa8 + 1) {
            operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            local_aa8->_vptr__Sp_counted_base);
          }
        }
        else {
          if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_aa8->_vptr__Sp_counted_base !=
                local_aa8 + 1) {
              operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              local_aa8->_vptr__Sp_counted_base);
            }
            operator_delete(p_Var11);
          }
          value.mError.mCode = kCancelled;
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    ((internal *)&ret,"rid.mId","1",&rid.mId,(int *)&value);
          if (ret == false) {
            testing::Message::Message((Message *)&value);
            if (ppuStack_a10 == (undefined **)0x0) {
              pcVar30 = "";
            }
            else {
              pcVar30 = *ppuStack_a10;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)policies,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x24c,pcVar30);
            testing::internal::AssertHelper::operator=((AssertHelper *)policies,(Message *)&value);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
            if (value.mError._0_8_ != 0) {
              (**(code **)(*(long *)value.mError._0_8_ + 8))();
            }
          }
          ppuVar14 = ppuStack_a10;
          if (ppuStack_a10 != (undefined **)0x0) {
            if (*ppuStack_a10 != (pointer)((long)ppuStack_a10 + 0x10)) {
              operator_delete(*ppuStack_a10);
            }
            operator_delete(ppuVar14);
          }
          peVar17 = ctx.mPS.
                    super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&converted_2,0);
          ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)local_b98,0);
          value.mError._0_8_ = &value.mError.mMessage._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>((string *)&value,"pan3","");
          policies[0]._0_8_ =
               &policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_finish;
          pp_Var32 = (_func_int **)0x26a8b5;
          std::__cxx11::string::_M_construct<char_const*>((string *)policies,"","");
          ot::commissioner::persistent_storage::Network::Network
                    ((Network *)&ret,(NetworkId *)&converted_2,(DomainId *)local_b98,
                     (string *)&value,3,3,3,(string *)policies,0);
          iVar19 = (*(peVar17->super_PersistentStorage)._vptr_PersistentStorage[6])
                             (peVar17,&ret,&nid);
          local_b48[0] = (char)iVar19;
          local_ad8._0_8_ = local_ad8._0_8_ & 0xffffffffffffff00;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                    ((internal *)commissionerAppMocks,
                     "ctx.mPS->Add(Network{0, 0, \"pan3\", 3, 3, 0x3, \"\", 0}, nid)",
                     "PersistentStorage::Status::kSuccess",local_b48,local_ad8);
          if (local_9e0 != (undefined1  [8])local_9d0) {
            operator_delete((void *)local_9e0);
          }
          if (ppuStack_a10 != (undefined **)local_a00) {
            operator_delete(ppuStack_a10);
          }
          if ((pointer *)policies[0]._0_8_ !=
              &policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish) {
            operator_delete((void *)policies[0]._0_8_);
          }
          if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
            operator_delete((void *)value.mError._0_8_);
          }
          if ((char)commissionerAppMocks[0].
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              '\0') {
            testing::Message::Message((Message *)&ret);
            if (commissionerAppMocks[0].
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              pp_Var32 = (commissionerAppMocks[0].
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&value,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x24e,(char *)pp_Var32);
            testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&ret);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
            if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )_ret != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
              (**(code **)(*_ret + 8))();
            }
            if (commissionerAppMocks[0].
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00137f02;
            local_aa8 = commissionerAppMocks[0].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (commissionerAppMocks[0].
                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_vptr__Sp_counted_base !=
                commissionerAppMocks[0].
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi + 1) {
              operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              (commissionerAppMocks[0].
                               super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base);
            }
          }
          else {
            if (commissionerAppMocks[0].
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (commissionerAppMocks[0].
                   super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_vptr__Sp_counted_base !=
                  commissionerAppMocks[0].
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi + 1) {
                operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                (commissionerAppMocks[0].
                                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi)->_vptr__Sp_counted_base);
              }
              operator_delete(commissionerAppMocks[0].
                              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
            }
            value.mError.mCode = kInvalidArgs;
            testing::internal::CmpHelperEQ<unsigned_int,int>
                      ((internal *)&ret,"nid.mId","2",&nid.mId,(int *)&value);
            if (ret == false) {
              testing::Message::Message((Message *)&value);
              if (ppuStack_a10 == (undefined **)0x0) {
                pcVar30 = "";
              }
              else {
                pcVar30 = *ppuStack_a10;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)policies,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x24f,pcVar30);
              testing::internal::AssertHelper::operator=((AssertHelper *)policies,(Message *)&value)
              ;
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
              if (value.mError._0_8_ != 0) {
                (**(code **)(*(long *)value.mError._0_8_ + 8))();
              }
            }
            ppuVar14 = ppuStack_a10;
            if (ppuStack_a10 != (undefined **)0x0) {
              if (*ppuStack_a10 != (pointer)((long)ppuStack_a10 + 0x10)) {
                operator_delete(*ppuStack_a10);
              }
              operator_delete(ppuVar14);
            }
            ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId
                      ((BorderRouterId *)&camIdx,0);
            policies[0]._0_8_ =
                 &policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
            std::__cxx11::string::_M_construct<char_const*>((string *)policies,"127.0.0.1","");
            local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            commissionerAppMocks[0].
            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)(commissionerAppMocks + 1);
            std::__cxx11::string::_M_construct<char_const*>((string *)commissionerAppMocks,"1.1","")
            ;
            ot::commissioner::BorderAgent::State::State(&local_84c,0,0,0,0,0);
            converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
                 &converted_2.fun_.super__Function_base._M_manager;
            std::__cxx11::string::_M_construct<char_const*>((string *)&converted_2,"");
            local_b98._0_8_ = local_b88;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b98,"");
            local_b48._0_8_ = local_b38;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b48,"");
            local_ad8._0_8_ = local_ac8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_ad8,"");
            json.m_type = null;
            json._1_7_ = 0;
            json.m_value.object = (object_t *)0x0;
            local_a78._M_unused._M_object = local_a68;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a78,"");
            local_a40._M_dataplus._M_p = (pointer)&local_a40.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a40);
            ot::commissioner::UnixTime::UnixTime(&local_6b0,0);
            pcVar30 = (char *)(ulong)(uint)local_84c;
            ot::commissioner::BorderAgent::BorderAgent
                      ((BorderAgent *)&value,(string *)policies,0x4e23,&local_a98,
                       (string *)commissionerAppMocks,local_84c,(string *)&converted_2,0,
                       (string *)local_b98,(string *)local_b48,(Timestamp)0x0,0,(string *)local_ad8,
                       (ByteArray *)&json,(string *)&local_a78,'\0',0,&local_a40,local_6b0,0xf);
            ot::commissioner::persistent_storage::BorderRouter::BorderRouter
                      ((BorderRouter *)&ret,(BorderRouterId *)&camIdx,&nid,(BorderAgent *)&value);
            iVar19 = (*((ctx.mPS.
                         super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super_PersistentStorage)._vptr_PersistentStorage[7])
                               (ctx.mPS.
                                super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,&ret,&rid);
            local_ad9 = (Status)iVar19;
            local_ada = kSuccess;
            testing::internal::
            CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                      (&local_ab0,
                       "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20003, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
                       ,"PersistentStorage::Status::kSuccess",&local_ad9,&local_ada);
            _ret = &PTR__BorderRouter_002dacd8;
            ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_a08);
            ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
              operator_delete(local_a40._M_dataplus._M_p);
            }
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a78._M_unused._0_8_ !=
                (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a68) {
              operator_delete(local_a78._M_unused._M_object);
            }
            if (json._0_8_ != 0) {
              operator_delete((void *)json._0_8_);
            }
            if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 *)local_ad8._0_8_ !=
                (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 *)local_ac8) {
              operator_delete((void *)local_ad8._0_8_);
            }
            if ((undefined1 *)local_b48._0_8_ != local_b38) {
              operator_delete((void *)local_b48._0_8_);
            }
            if ((undefined1 *)local_b98._0_8_ != local_b88) {
              operator_delete((void *)local_b98._0_8_);
            }
            if ((_Manager_type *)converted_2.fun_.super__Function_base._M_functor._M_unused._0_8_ !=
                &converted_2.fun_.super__Function_base._M_manager) {
              operator_delete(converted_2.fun_.super__Function_base._M_functor._M_unused._M_object);
            }
            if (commissionerAppMocks[0].
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)(commissionerAppMocks + 1)) {
              operator_delete(commissionerAppMocks[0].
                              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
            }
            if (local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a98.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if ((pointer *)policies[0]._0_8_ !=
                &policies[0].mFlags.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
              operator_delete((void *)policies[0]._0_8_);
            }
            p_Var11 = local_aa8;
            if (local_ab0 != (internal)0x0) {
              if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_aa8->_vptr__Sp_counted_base != local_aa8 + 1) {
                  operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  local_aa8->_vptr__Sp_counted_base);
                }
                operator_delete(p_Var11);
              }
              value.mError.mCode = kInvalidArgs;
              testing::internal::CmpHelperEQ<unsigned_int,int>
                        ((internal *)&ret,"rid.mId","2",&rid.mId,(int *)&value);
              if (ret == false) {
                testing::Message::Message((Message *)&value);
                if (ppuStack_a10 == (undefined **)0x0) {
                  pcVar31 = "";
                }
                else {
                  pcVar31 = *ppuStack_a10;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)policies,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,599,pcVar31);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)policies,(Message *)&value);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
                if (value.mError._0_8_ != 0) {
                  (**(code **)(*(long *)value.mError._0_8_ + 8))();
                }
              }
              ppuVar14 = ppuStack_a10;
              if (ppuStack_a10 != (undefined **)0x0) {
                if (*ppuStack_a10 != (pointer)((long)ppuStack_a10 + 0x10)) {
                  operator_delete(*ppuStack_a10);
                }
                operator_delete(ppuVar14);
              }
              _ret = (undefined **)local_a08;
              std::__cxx11::string::_M_construct<char_const*>((string *)&ret,".","");
              JobManagerTestSuite::Init(&this->super_JobManagerTestSuite,&ctx,(string *)&ret);
              if (_ret != (undefined **)local_a08) {
                operator_delete(_ret);
              }
              camIdx = '\0';
              pCVar20 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar20,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar20);
              commissionerAppMocks[0].
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar20;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                        (&commissionerAppMocks[0].
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,pCVar20);
              pCVar20 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar20,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar20);
              commissionerAppMocks[1].
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar20;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                        (&commissionerAppMocks[1].
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,pCVar20);
              pCVar20 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar20,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar20);
              commissionerAppMocks[2].
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar20;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                        (&commissionerAppMocks[2].
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,pCVar20);
              local_a78._8_8_ = operator_new(8);
              (((MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
               local_a78._8_8_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002dd928;
              local_a78._M_unused._M_object = &PTR__MatcherBase_002daa30;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a68,
                         (MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                         local_a78._8_8_);
              local_a78._M_unused._M_object = &PTR__MatcherBase_002da9e8;
              local_a40._M_string_length = (size_type)operator_new(8);
              (((MatcherInterface<const_ot::commissioner::Config_&> *)local_a40._M_string_length)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002dd9f0;
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002daa98;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<ot::commissioner::Config_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_a40.field_2._M_allocated_capacity,
                         (MatcherInterface<const_ot::commissioner::Config_&> *)
                         local_a40._M_string_length);
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002daa50;
              CommissionerAppStaticExpecter::gmock_Create
                        ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                          *)&value,&ctx.mCommissionerAppStaticExpecter,
                         (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_a78
                         ,(Matcher<const_ot::commissioner::Config_&> *)&local_a40);
              testing::internal::GetWithoutMatchers();
              pTVar21 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                        ::InternalExpectedAt
                                  ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                    *)&value,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x260,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
              pTVar21 = testing::internal::
                        TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                        ::Times(pTVar21,3);
              paVar4 = &local_420.mMessage.field_2;
              local_420.mCode = kNone;
              local_420.mMessage._M_string_length = 0;
              local_420.mMessage.field_2._M_local_buf[0] = '\0';
              local_420.mMessage._M_dataplus._M_p = (pointer)paVar4;
              testing::Return<ot::commissioner::Error>((testing *)&local_a98,&local_420);
              local_ad8._0_8_ =
                   local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              local_ad8._8_8_ =
                   local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)
                   ((long)local_a98.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish + 8) =
                       *(_Atomic_word *)
                        ((long)local_a98.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)
                   ((long)local_a98.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish + 8) =
                       *(_Atomic_word *)
                        ((long)local_a98.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                }
              }
              policies[0]._0_8_ = commissionerAppMocks;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)std::
                            _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:611:30)>
                            ::_M_manager;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)std::
                            _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:611:30)>
                            ::_M_invoke;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)&camIdx;
              local_ac8._0_8_ = policies[0]._0_8_;
              local_ac8._8_8_ = (BorderRouterId *)&camIdx;
              std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                        ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                         &converted_2,
                         (function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                         policies);
              local_b88._0_8_ = 0;
              local_b88._8_8_ = 0;
              local_b98._0_8_ = (pointer)0x0;
              local_b98._8_8_ = 0;
              local_b98._0_8_ = operator_new(0x20);
              *(undefined8 *)local_b98._0_8_ = 0;
              *(undefined8 *)(local_b98._0_8_ + 8) = 0;
              *(undefined8 *)(local_b98._0_8_ + 0x10) = 0;
              *(_Invoker_type *)(local_b98._0_8_ + 0x18) = converted_2.fun_._M_invoker;
              if (converted_2.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
                *(undefined4 *)local_b98._0_8_ =
                     converted_2.fun_.super__Function_base._M_functor._0_4_;
                *(undefined4 *)(local_b98._0_8_ + 4) =
                     converted_2.fun_.super__Function_base._M_functor._4_4_;
                *(undefined4 *)(local_b98._0_8_ + 8) =
                     converted_2.fun_.super__Function_base._M_functor._8_4_;
                *(undefined4 *)(local_b98._0_8_ + 0xc) =
                     converted_2.fun_.super__Function_base._M_functor._12_4_;
                *(_Manager_type *)(local_b98._0_8_ + 0x10) =
                     converted_2.fun_.super__Function_base._M_manager;
              }
              local_b98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_b88._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_b88._8_8_ = std::_Function_handler::operator_cast_to_Action;
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                (*(code *)policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish)(policies,policies,3);
              }
              __l._M_len = 1;
              __l._M_array = (iterator)local_b98;
              std::
              vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
              ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                        *)&ret,__l,(allocator_type *)policies);
              if ((code *)local_b88._0_8_ != (code *)0x0) {
                (*(code *)local_b88._0_8_)(local_b98,local_b98,3);
              }
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                          *)local_a00,(ReturnAction *)local_ad8);
              local_b38._0_8_ = 0;
              local_b38._8_8_ = 0;
              local_b48._0_8_ = (pointer)0x0;
              local_b48._8_8_ = 0;
              local_b48._0_8_ = operator_new(0x38);
              ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b48._0_8_)->
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )_ret;
              ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_b48._0_8_ + 8))->
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )ppuStack_a10;
              ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_b48._0_8_ + 0x10))->
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   = (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      )local_a08;
              local_a08 = (undefined1  [8])0x0;
              _ret = (undefined **)0x0;
              ppuStack_a10 = (undefined **)0x0;
              ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_b48._0_8_ + 0x28))->
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_b48._0_8_ + 0x18))->
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_b48._0_8_ + 0x20))->
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_b48._0_8_ + 0x30))->
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )local_9f0._8_8_;
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9f0._M_allocated_capacity !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_b48._0_8_ + 0x18))->
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     = (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )local_a00;
                ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_b48._0_8_ + 0x20))->
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     = (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )ppuStack_9f8;
                ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_b48._0_8_ + 0x28))->
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     = (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )local_9f0._M_allocated_capacity;
                local_9f0._M_allocated_capacity = 0;
                local_9f0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              local_b48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_b38._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_b38._8_8_ = std::_Function_handler::operator_cast_to_Action;
              std::
              vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
              ::~vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                         *)&ret);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
              ::WillRepeatedly(pTVar21,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                        *)local_b48);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b38._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                (*(code *)local_b38._0_8_)(local_b48,local_b48,3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ad8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ad8._8_8_);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a98.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_420.mMessage._M_dataplus._M_p != paVar4) {
                operator_delete(local_420.mMessage._M_dataplus._M_p);
              }
              value.mError.mMessage.field_2._8_8_ = &PTR__MatcherBase_002daa30;
              if (value.mData._M_string_length != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           value.mData._M_string_length);
              }
              value.mError.mMessage._M_dataplus._M_p = "$<\x14";
              if (value.mError.mMessage.field_2._M_allocated_capacity != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           value.mError.mMessage.field_2._M_allocated_capacity);
              }
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002daa98;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a40.field_2._M_allocated_capacity !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a40.field_2._M_allocated_capacity);
              }
              local_a78._M_unused._M_object = &PTR__MatcherBase_002daa30;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._0_8_);
              }
              pFVar1 = &(commissionerAppMocks[0].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->gmock10_IsActive_81;
              testing::internal::UntypedFunctionMockerBase::RegisterOwner
                        (&pFVar1->super_UntypedFunctionMockerBase,
                         commissionerAppMocks[0].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ;
              policies[0]._0_8_ = pFVar1;
              testing::internal::GetWithoutMatchers();
              pTVar22 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                                  ((MockSpec<bool_()> *)policies,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x265,"*commissionerAppMocks[0]","IsActive()");
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object = operator_new(1)
              ;
              *converted_2.fun_.super__Function_base._M_functor._M_unused._M_function_pointer =
                   (_func_void)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&converted_2.fun_.super__Function_base._M_functor + 8),
                         (bool *)converted_2.fun_.super__Function_base._M_functor._M_unused._0_8_);
              pAVar23 = (ActionInterface<bool_()> *)operator_new(0x10);
              pAVar23->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002de2c8;
              uVar7 = *converted_2.fun_.super__Function_base._M_functor._M_unused._M_object;
              *(undefined1 *)&pAVar23[1]._vptr_ActionInterface = uVar7;
              *(undefined1 *)((long)&pAVar23[1]._vptr_ActionInterface + 1) = uVar7;
              testing::Action<bool_()>::Action((Action<bool_()> *)&ret,pAVar23);
              pTVar22 = testing::internal::TypedExpectation<bool_()>::WillOnce
                                  (pTVar22,(Action<bool_()> *)&ret);
              local_b98._0_8_ = operator_new(1);
              *(bool *)local_b98._0_8_ = true;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b98 + 8),
                         (bool *)local_b98._0_8_);
              pAVar23 = (ActionInterface<bool_()> *)operator_new(0x10);
              pAVar23->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002de2c8;
              bVar18 = *(bool *)local_b98._0_8_;
              *(bool *)&pAVar23[1]._vptr_ActionInterface = bVar18;
              *(bool *)((long)&pAVar23[1]._vptr_ActionInterface + 1) = bVar18;
              testing::Action<bool_()>::Action((Action<bool_()> *)&value,pAVar23);
              testing::internal::TypedExpectation<bool_()>::WillRepeatedly
                        (pTVar22,(Action<bool_()> *)&value);
              if (value.mError.mMessage._M_string_length != 0) {
                (*(code *)value.mError.mMessage._M_string_length)(&value,&value,3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b98._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b98._8_8_);
              }
              if (local_a08 != (undefined1  [8])0x0) {
                (*(code *)local_a08)(&ret,&ret,3);
              }
              if (converted_2.fun_.super__Function_base._M_functor._8_8_ != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           converted_2.fun_.super__Function_base._M_functor._8_8_);
              }
              pFVar1 = &(commissionerAppMocks[1].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->gmock10_IsActive_81;
              testing::internal::UntypedFunctionMockerBase::RegisterOwner
                        (&pFVar1->super_UntypedFunctionMockerBase,
                         commissionerAppMocks[1].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ;
              policies[0]._0_8_ = pFVar1;
              testing::internal::GetWithoutMatchers();
              pTVar22 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                                  ((MockSpec<bool_()> *)policies,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x266,"*commissionerAppMocks[1]","IsActive()");
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object = operator_new(1)
              ;
              *converted_2.fun_.super__Function_base._M_functor._M_unused._M_function_pointer =
                   (_func_void)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&converted_2.fun_.super__Function_base._M_functor + 8),
                         (bool *)converted_2.fun_.super__Function_base._M_functor._M_unused._0_8_);
              pAVar23 = (ActionInterface<bool_()> *)operator_new(0x10);
              pAVar23->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002de2c8;
              uVar7 = *converted_2.fun_.super__Function_base._M_functor._M_unused._M_object;
              *(undefined1 *)&pAVar23[1]._vptr_ActionInterface = uVar7;
              *(undefined1 *)((long)&pAVar23[1]._vptr_ActionInterface + 1) = uVar7;
              testing::Action<bool_()>::Action((Action<bool_()> *)&ret,pAVar23);
              pTVar22 = testing::internal::TypedExpectation<bool_()>::WillOnce
                                  (pTVar22,(Action<bool_()> *)&ret);
              local_b98._0_8_ = operator_new(1);
              *(bool *)local_b98._0_8_ = true;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b98 + 8),
                         (bool *)local_b98._0_8_);
              pAVar23 = (ActionInterface<bool_()> *)operator_new(0x10);
              pAVar23->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002de2c8;
              bVar18 = *(bool *)local_b98._0_8_;
              *(bool *)&pAVar23[1]._vptr_ActionInterface = bVar18;
              *(bool *)((long)&pAVar23[1]._vptr_ActionInterface + 1) = bVar18;
              testing::Action<bool_()>::Action((Action<bool_()> *)&value,pAVar23);
              testing::internal::TypedExpectation<bool_()>::WillRepeatedly
                        (pTVar22,(Action<bool_()> *)&value);
              if (value.mError.mMessage._M_string_length != 0) {
                (*(code *)value.mError.mMessage._M_string_length)(&value,&value,3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b98._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b98._8_8_);
              }
              if (local_a08 != (undefined1  [8])0x0) {
                (*(code *)local_a08)(&ret,&ret,3);
              }
              if (converted_2.fun_.super__Function_base._M_functor._8_8_ != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           converted_2.fun_.super__Function_base._M_functor._8_8_);
              }
              pFVar1 = &(commissionerAppMocks[2].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->gmock10_IsActive_81;
              testing::internal::UntypedFunctionMockerBase::RegisterOwner
                        (&pFVar1->super_UntypedFunctionMockerBase,
                         commissionerAppMocks[2].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ;
              value.mError._0_8_ = pFVar1;
              testing::internal::GetWithoutMatchers();
              pTVar22 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                                  ((MockSpec<bool_()> *)&value,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x267,"*commissionerAppMocks[2]","IsActive()");
              policies[0]._0_8_ = operator_new(1);
              *(bool *)policies[0]._0_8_ = false;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&policies[0].mFlags,
                         (bool *)policies[0]._0_8_);
              pAVar23 = (ActionInterface<bool_()> *)operator_new(0x10);
              pAVar23->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002de2c8;
              uVar7 = *(undefined1 *)policies[0]._0_8_;
              *(undefined1 *)&pAVar23[1]._vptr_ActionInterface = uVar7;
              *(undefined1 *)((long)&pAVar23[1]._vptr_ActionInterface + 1) = uVar7;
              testing::Action<bool_()>::Action((Action<bool_()> *)&ret,pAVar23);
              testing::internal::TypedExpectation<bool_()>::WillRepeatedly
                        (pTVar22,(Action<bool_()> *)&ret);
              if (local_a08 != (undefined1  [8])0x0) {
                (*(code *)local_a08)(&ret,&ret,3);
              }
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           policies[0].mFlags.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
              }
              value.mError._0_8_ = &value.mError.mMessage._M_string_length;
              std::__cxx11::string::_M_construct<char_const*>((string *)&value,"start","");
              __l_00._M_len = 1;
              __l_00._M_array = (iterator)&value;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)policies,__l_00,(allocator_type *)&local_a78);
              local_b98._0_8_ = (pointer)0x1;
              local_b98._8_8_ = 2;
              local_b88._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
              __l_01._M_len = 3;
              __l_01._M_array = (iterator)local_b98;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&converted_2,
                         __l_01,(allocator_type *)&local_a40);
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)&ret,&ctx.mJobManager,(Expression *)policies,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&converted_2,false
                        );
              local_ad8._0_8_ = local_ad8._0_8_ & 0xffffffff00000000;
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)local_b48,
                         "ctx.mJobManager.PrepareJobs({\"start\"}, {0x1, 0x02, 0x03}, false).mCode",
                         "ErrorCode::kNone",(ErrorCode *)&ret,(ErrorCode *)local_ad8);
              if (ppuStack_a10 != (undefined **)local_a00) {
                operator_delete(ppuStack_a10);
              }
              if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                  (void *)0x0) {
                operator_delete(converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                               );
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)policies);
              if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
                operator_delete((void *)value.mError._0_8_);
              }
              if ((string)local_b48[0] == (string)0x0) {
                testing::Message::Message((Message *)&ret);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b48._8_8_ ==
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  pcVar31 = "";
                }
                else {
                  pcVar31 = *(char **)local_b48._8_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&value,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x269,pcVar31);
                testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&ret);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x0) {
                  (**(code **)((long)*_ret + 8))();
                }
              }
              uVar9 = local_b48._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b48._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_b48._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b48._8_8_ + 0x10)) {
                  operator_delete(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_b48._8_8_)
                  ;
                }
                operator_delete((void *)uVar9);
              }
              peVar15 = commissionerAppMocks[0].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
              (((MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)policies[0].mFlags.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start)->super_MatcherDescriberInterface).
              _vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002ddca8;
              policies[0]._0_8_ = &PTR__MatcherBase_002db840;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<std::__cxx11::string&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish,
                         (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)policies[0].mFlags.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
              policies[0]._0_8_ = &PTR__MatcherBase_002db7f8;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = operator_new(8);
              (((MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)converted_2.fun_.super__Function_base._M_functor._8_8_)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002ddd60;
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
                   &PTR__MatcherBase_002db2e8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<std::__cxx11::string_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &converted_2.fun_.super__Function_base._M_manager,
                         (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)converted_2.fun_.super__Function_base._M_functor._8_8_);
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
                   &PTR__MatcherBase_002db2a0;
              local_b98._8_8_ = operator_new(8);
              (((MatcherInterface<const_unsigned_short_&> *)local_b98._8_8_)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002dde18;
              local_b98._0_8_ = &PTR__MatcherBase_002db4b0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_b88,
                         (MatcherInterface<const_unsigned_short_&> *)local_b98._8_8_);
              local_b98._0_8_ = &PTR__MatcherBase_002db468;
              CommissionerAppMock::gmock_Start
                        ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)&ret,peVar15,
                         (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)policies,
                         (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&converted_2,(Matcher<unsigned_short> *)local_b98);
              testing::internal::GetWithoutMatchers();
              pTVar24 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                    *)&ret,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x26b,"*commissionerAppMocks[0]","Start(_, _, _)");
              pTVar24 = testing::internal::
                        TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::Times(pTVar24,1);
              paVar4 = &local_448.mMessage.field_2;
              local_448.mCode = kNone;
              local_448.mMessage._M_string_length = 0;
              local_448.mMessage.field_2._M_local_buf[0] = '\0';
              local_448.mMessage._M_dataplus._M_p = (pointer)paVar4;
              testing::Return<ot::commissioner::Error>((testing *)local_b48,&local_448);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)&value,(ReturnAction *)local_b48);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::WillOnce(pTVar24,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                  *)&value);
              if (value.mError.mMessage._M_string_length != 0) {
                (*(code *)value.mError.mMessage._M_string_length)(&value,&value,3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b48._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b48._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_448.mMessage._M_dataplus._M_p != paVar4) {
                operator_delete(local_448.mMessage._M_dataplus._M_p);
              }
              local_9e0 = (undefined1  [8])&PTR__MatcherBase_002db840;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._0_8_);
              }
              ppuStack_9f8 = &PTR__MatcherBase_002db2e8;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9f0._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9f0._8_8_);
              }
              ppuStack_a10 = &PTR__MatcherBase_002db4b0;
              if (local_a00 != (undefined1  [8])0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a00);
              }
              local_b98._0_8_ = &PTR__MatcherBase_002db4b0;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b88._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b88._0_8_);
              }
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
                   &PTR__MatcherBase_002db2e8;
              if (converted_2.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           converted_2.fun_.super__Function_base._M_manager);
              }
              policies[0]._0_8_ = &PTR__MatcherBase_002db840;
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           policies[0].mFlags.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              }
              peVar15 = commissionerAppMocks[1].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
              (((MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)policies[0].mFlags.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start)->super_MatcherDescriberInterface).
              _vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002ddca8;
              policies[0]._0_8_ = &PTR__MatcherBase_002db840;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<std::__cxx11::string&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish,
                         (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)policies[0].mFlags.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
              policies[0]._0_8_ = &PTR__MatcherBase_002db7f8;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = operator_new(8);
              (((MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)converted_2.fun_.super__Function_base._M_functor._8_8_)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002ddd60;
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
                   &PTR__MatcherBase_002db2e8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<std::__cxx11::string_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &converted_2.fun_.super__Function_base._M_manager,
                         (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)converted_2.fun_.super__Function_base._M_functor._8_8_);
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
                   &PTR__MatcherBase_002db2a0;
              local_b98._8_8_ = operator_new(8);
              (((MatcherInterface<const_unsigned_short_&> *)local_b98._8_8_)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002dde18;
              local_b98._0_8_ = &PTR__MatcherBase_002db4b0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_b88,
                         (MatcherInterface<const_unsigned_short_&> *)local_b98._8_8_);
              local_b98._0_8_ = &PTR__MatcherBase_002db468;
              CommissionerAppMock::gmock_Start
                        ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)&ret,peVar15,
                         (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)policies,
                         (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&converted_2,(Matcher<unsigned_short> *)local_b98);
              testing::internal::GetWithoutMatchers();
              pTVar24 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                    *)&ret,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x26c,"*commissionerAppMocks[1]","Start(_, _, _)");
              pTVar24 = testing::internal::
                        TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::Times(pTVar24,1);
              paVar4 = &local_470.mMessage.field_2;
              local_470.mCode = kNone;
              local_470.mMessage._M_string_length = 0;
              local_470.mMessage.field_2._M_local_buf[0] = '\0';
              local_470.mMessage._M_dataplus._M_p = (pointer)paVar4;
              testing::Return<ot::commissioner::Error>((testing *)local_b48,&local_470);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)&value,(ReturnAction *)local_b48);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::WillOnce(pTVar24,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                  *)&value);
              if (value.mError.mMessage._M_string_length != 0) {
                (*(code *)value.mError.mMessage._M_string_length)(&value,&value,3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b48._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b48._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_470.mMessage._M_dataplus._M_p != paVar4) {
                operator_delete(local_470.mMessage._M_dataplus._M_p);
              }
              local_9e0 = (undefined1  [8])&PTR__MatcherBase_002db840;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._0_8_);
              }
              ppuStack_9f8 = &PTR__MatcherBase_002db2e8;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9f0._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9f0._8_8_);
              }
              ppuStack_a10 = &PTR__MatcherBase_002db4b0;
              if (local_a00 != (undefined1  [8])0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a00);
              }
              local_b98._0_8_ = &PTR__MatcherBase_002db4b0;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b88._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b88._0_8_);
              }
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
                   &PTR__MatcherBase_002db2e8;
              if (converted_2.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           converted_2.fun_.super__Function_base._M_manager);
              }
              policies[0]._0_8_ = &PTR__MatcherBase_002db840;
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           policies[0].mFlags.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              }
              peVar15 = commissionerAppMocks[2].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = operator_new(8);
              (((MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)converted_2.fun_.super__Function_base._M_functor._8_8_)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002ddca8;
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
                   &PTR__MatcherBase_002db840;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<std::__cxx11::string&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &converted_2.fun_.super__Function_base._M_manager,
                         (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)converted_2.fun_.super__Function_base._M_functor._8_8_);
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
                   &PTR__MatcherBase_002db7f8;
              local_b98._8_8_ = operator_new(8);
              (((MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)local_b98._8_8_)->super_MatcherDescriberInterface).
              _vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002ddd60;
              local_b98._0_8_ = &PTR__MatcherBase_002db2e8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<std::__cxx11::string_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_b88,
                         (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)local_b98._8_8_);
              local_b98._0_8_ = &PTR__MatcherBase_002db2a0;
              local_b48._8_8_ = operator_new(8);
              (((MatcherInterface<const_unsigned_short_&> *)local_b48._8_8_)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002dde18;
              local_b48._0_8_ = &PTR__MatcherBase_002db4b0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_b38,
                         (MatcherInterface<const_unsigned_short_&> *)local_b48._8_8_);
              local_b48._0_8_ = &PTR__MatcherBase_002db468;
              CommissionerAppMock::gmock_Start
                        ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)&ret,peVar15,
                         (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&converted_2,
                         (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)local_b98,(Matcher<unsigned_short> *)local_b48);
              pJVar5 = &ctx.mJobManager;
              testing::internal::GetWithoutMatchers();
              pTVar24 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                    *)&ret,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x26d,"*commissionerAppMocks[2]","Start(_, _, _)");
              pTVar24 = testing::internal::
                        TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::Times(pTVar24,1);
              policies[0]._0_8_ =
                   &policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
              std::__cxx11::string::_M_construct<char_const*>((string *)policies,"Aborted","");
              local_588._0_4_ = kAborted;
              local_580._M_p = local_570;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_580,policies[0]._0_8_,
                         policies[0].mFlags.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + policies[0]._0_8_);
              testing::Return<ot::commissioner::Error>((testing *)local_ad8,(Error *)local_588);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)&value,(ReturnAction *)local_ad8);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::WillOnce(pTVar24,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                  *)&value);
              if (value.mError.mMessage._M_string_length != 0) {
                (*(code *)value.mError.mMessage._M_string_length)(&value,&value,3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ad8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ad8._8_8_);
              }
              if (local_580._M_p != local_570) {
                operator_delete(local_580._M_p);
              }
              ppuVar6 = &policies[0].mFlags.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              if ((pointer *)policies[0]._0_8_ != ppuVar6) {
                operator_delete((void *)policies[0]._0_8_);
              }
              local_9e0 = (undefined1  [8])&PTR__MatcherBase_002db840;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._0_8_);
              }
              ppuStack_9f8 = &PTR__MatcherBase_002db2e8;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9f0._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9f0._8_8_);
              }
              ppuStack_a10 = &PTR__MatcherBase_002db4b0;
              if (local_a00 != (undefined1  [8])0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a00);
              }
              local_b48._0_8_ = &PTR__MatcherBase_002db4b0;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b38._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b38._0_8_);
              }
              local_b98._0_8_ = &PTR__MatcherBase_002db2e8;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b88._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b88._0_8_);
              }
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
                   &PTR__MatcherBase_002db840;
              if (converted_2.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           converted_2.fun_.super__Function_base._M_manager);
              }
              ot::commissioner::JobManager::RunJobs(pJVar5);
              ot::commissioner::JobManager::CollectJobsValue(&value,pJVar5);
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)&ret,&value);
              nlohmann::detail::input_adapter::
              input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                        ((input_adapter *)policies,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )_ret,(char *)((long)ppuStack_a10 + (long)_ret));
              local_598 = (code *)0x0;
              uStack_590 = 0;
              local_5a8._M_unused._M_object = (void *)0x0;
              local_5a8._8_8_ = 0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse(&json,(input_adapter *)policies,(parser_callback_t *)&local_5a8,true);
              if (local_598 != (code *)0x0) {
                (*local_598)(&local_5a8,&local_5a8,3);
              }
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           policies[0].mFlags.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
              }
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_a08) {
                operator_delete(_ret);
              }
              bVar18 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000001");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[0].mRotationTime._0_1_ = bVar18;
              if (!bVar18) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x276,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000002");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x277,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              bVar18 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000003");
              policies[0].mRotationTime._0_1_ = !bVar18;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (bVar18) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000003\")","true","false"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x278,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              ot::commissioner::JobManager::CleanupJobs(pJVar5);
              policies[0]._0_8_ = ppuVar6;
              std::__cxx11::string::_M_construct<char_const*>((string *)policies,"active","");
              __l_02._M_len = 1;
              __l_02._M_array = (iterator)policies;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&converted_2,__l_02,(allocator_type *)&local_a40);
              pJVar5 = &ctx.mJobManager;
              local_b48._0_8_ = (pointer)0x1;
              local_b48._8_8_ = (undefined8 *)0x2;
              local_b38._0_8_ = 3;
              __l_03._M_len = 3;
              __l_03._M_array = (iterator)local_b48;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b98,__l_03,
                         (allocator_type *)&local_a98);
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)&ret,pJVar5,(Expression *)&converted_2,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b98,false);
              local_a78._M_unused._M_member_pointer =
                   local_a78._M_unused._M_member_pointer & 0xffffffff00000000;
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)local_ad8,
                         "ctx.mJobManager.PrepareJobs({\"active\"}, {0x1, 0x2, 0x3}, false).mCode",
                         "ErrorCode::kNone",(ErrorCode *)&ret,(ErrorCode *)local_a78._M_pod_data);
              if (ppuStack_a10 != (undefined **)local_a00) {
                operator_delete(ppuStack_a10);
              }
              if ((undefined **)local_b98._0_8_ != (undefined **)0x0) {
                operator_delete((void *)local_b98._0_8_);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&converted_2);
              if ((pointer *)policies[0]._0_8_ != ppuVar6) {
                operator_delete((void *)policies[0]._0_8_);
              }
              if ((ReturnAction)local_ad8[0] == (ReturnAction)0x0) {
                testing::Message::Message((Message *)&ret);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ad8._8_8_ ==
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  pcVar31 = "";
                }
                else {
                  pcVar31 = *(char **)local_ad8._8_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)policies,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x27c,pcVar31);
                testing::internal::AssertHelper::operator=((AssertHelper *)policies,(Message *)&ret)
                ;
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
                if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )_ret != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                  (**(code **)((long)*_ret + 8))();
                }
              }
              uVar9 = local_ad8._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ad8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_ad8._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_ad8._8_8_ + 0x10)) {
                  operator_delete(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_ad8._8_8_)
                  ;
                }
                operator_delete((void *)uVar9);
              }
              ot::commissioner::JobManager::RunJobs(pJVar5);
              ot::commissioner::JobManager::CollectJobsValue((Value *)&ret,pJVar5);
              value.mError.mCode = _ret;
              std::__cxx11::string::operator=
                        ((string *)&value.mError.mMessage,(string *)&ppuStack_a10);
              std::__cxx11::string::operator=
                        ((string *)&value.mData,(string *)local_9f0._M_local_buf);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9f0._M_allocated_capacity !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9e0) {
                operator_delete((void *)local_9f0._M_allocated_capacity);
              }
              if (ppuStack_a10 != (undefined **)local_a00) {
                operator_delete(ppuStack_a10);
              }
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)&ret,&value);
              nlohmann::detail::input_adapter::
              input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                        ((input_adapter *)policies,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )_ret,(char *)((long)ppuStack_a10 + (long)_ret));
              local_5b8 = (code *)0x0;
              uStack_5b0 = 0;
              local_5c8._M_unused._M_object = (void *)0x0;
              local_5c8._8_8_ = 0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_658,(input_adapter *)policies,(parser_callback_t *)&local_5c8,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_658);
              jVar13 = json.m_value;
              vVar12 = json.m_type;
              json.m_type = local_658[0];
              local_658[0] = vVar12;
              json.m_value = local_650;
              local_650 = jVar13;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant(&json);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_658);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy
                        ((json_value *)
                         &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_658)->m_value,local_658[0]);
              if (local_5b8 != (code *)0x0) {
                (*local_5b8)(&local_5c8,&local_5c8,__destroy_functor);
              }
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           policies[0].mFlags.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
              }
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_a08) {
                operator_delete(_ret);
              }
              bVar18 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000001");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[0].mRotationTime._0_1_ = bVar18;
              if (!bVar18) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x280,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000002");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x281,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000003");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000003\")","false","true"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x282,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&json,"0x0000000000000001");
              nlohmann::detail::
              from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        (pvVar25,&ret);
              policies[0].mRotationTime._0_1_ = ret;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (ret == false) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json[\"0x0000000000000001\"]","false","true",pcVar30)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x283,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&json,"0x0000000000000002");
              nlohmann::detail::
              from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        (pvVar25,&ret);
              policies[0].mRotationTime._0_1_ = ret;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (ret == false) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json[\"0x0000000000000002\"]","false","true",pcVar30)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x284,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&json,"0x0000000000000003");
              nlohmann::detail::
              from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        (pvVar25,&ret);
              policies[0]._0_8_ = CONCAT71(policies[0]._1_7_,ret) ^ 1;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (ret != false) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json[\"0x0000000000000003\"]","true","false",pcVar30)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x285,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              ot::commissioner::JobManager::CleanupJobs(pJVar5);
              policies[0]._0_8_ = ppuVar6;
              std::__cxx11::string::_M_construct<char_const*>((string *)policies,"sessionid","");
              __l_04._M_len = 1;
              __l_04._M_array = (iterator)policies;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&converted_2,__l_04,(allocator_type *)&local_a40);
              local_ad8._0_8_ = (pointer)0x1;
              local_ad8._8_8_ = 2;
              __l_05._M_len = 2;
              __l_05._M_array = (iterator)local_ad8;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b98,__l_05,
                         (allocator_type *)&local_a98);
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)&ret,&ctx.mJobManager,(Expression *)&converted_2,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b98,false);
              local_a78._M_unused._M_member_pointer =
                   local_a78._M_unused._M_member_pointer & 0xffffffff00000000;
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)local_b48,
                         "ctx.mJobManager.PrepareJobs({\"sessionid\"}, {0x1, 0x2}, false).mCode",
                         "ErrorCode::kNone",(ErrorCode *)&ret,(ErrorCode *)local_a78._M_pod_data);
              if (ppuStack_a10 != (undefined **)local_a00) {
                operator_delete(ppuStack_a10);
              }
              if ((undefined **)local_b98._0_8_ != (undefined **)0x0) {
                operator_delete((void *)local_b98._0_8_);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&converted_2);
              if ((pointer *)policies[0]._0_8_ != ppuVar6) {
                operator_delete((void *)policies[0]._0_8_);
              }
              if ((string)local_b48[0] == (string)0x0) {
                testing::Message::Message((Message *)&ret);
                if ((undefined8 *)local_b48._8_8_ == (undefined8 *)0x0) {
                  pcVar31 = "";
                }
                else {
                  pcVar31 = *(char **)local_b48._8_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)policies,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x289,pcVar31);
                testing::internal::AssertHelper::operator=((AssertHelper *)policies,(Message *)&ret)
                ;
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
                if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                     )_ret != (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )0x0) {
                  (**(code **)((long)*_ret + 8))();
                }
              }
              uVar9 = local_b48._8_8_;
              if ((undefined8 *)local_b48._8_8_ != (undefined8 *)0x0) {
                if (*(undefined8 **)local_b48._8_8_ != (undefined8 *)(local_b48._8_8_ + 0x10)) {
                  operator_delete(*(undefined8 **)local_b48._8_8_);
                }
                operator_delete((void *)uVar9);
              }
              peVar15 = commissionerAppMocks[0].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_a78._8_8_ = operator_new(8);
              (((MatcherInterface<unsigned_short_&> *)local_a78._8_8_)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002de648;
              local_a78._M_unused._M_object = &PTR__MatcherBase_002dbb50;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<unsigned_short&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a68,
                         (MatcherInterface<unsigned_short_&> *)local_a78._8_8_);
              local_a78._M_unused._M_object = &PTR__MatcherBase_002dbb08;
              CommissionerAppMock::gmock_GetSessionId
                        ((MockSpec<ot::commissioner::Error_(unsigned_short_&)> *)local_b48,peVar15,
                         (Matcher<unsigned_short_&> *)&local_a78);
              testing::internal::GetWithoutMatchers();
              pTVar26 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
                        InternalExpectedAt((MockSpec<ot::commissioner::Error_(unsigned_short_&)> *)
                                           local_b48,
                                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                           ,0x28a,"*commissionerAppMocks[0]","GetSessionId(_)");
              paVar4 = &local_498.mMessage.field_2;
              local_498.mCode = kNone;
              local_498.mMessage._M_string_length = 0;
              local_498.mMessage.field_2._M_local_buf[0] = '\0';
              local_498.mMessage._M_dataplus._M_p = (pointer)paVar4;
              testing::Return<ot::commissioner::Error>((testing *)&local_a98,&local_498);
              local_a40._M_dataplus._M_p =
                   (pointer)local_a98.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              local_a40._M_string_length =
                   (size_type)
                   local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)
                   ((long)local_a98.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish + 8) =
                       *(_Atomic_word *)
                        ((long)local_a98.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)
                   ((long)local_a98.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish + 8) =
                       *(_Atomic_word *)
                        ((long)local_a98.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                }
              }
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)std::
                            _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:651:36)>
                            ::_M_manager;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)std::
                            _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:651:36)>
                            ::_M_invoke;
              std::function<void_(unsigned_short_&)>::function
                        ((function<void_(unsigned_short_&)> *)&converted_2,
                         (function<void_(unsigned_short_&)> *)policies);
              local_b88._0_8_ = 0;
              local_b88._8_8_ = 0;
              local_b98._0_8_ = (pointer)0x0;
              local_b98._8_8_ = 0;
              local_b98._0_8_ = operator_new(0x20);
              *(undefined8 *)local_b98._0_8_ = 0;
              *(undefined8 *)(local_b98._0_8_ + 8) = 0;
              *(undefined8 *)(local_b98._0_8_ + 0x10) = 0;
              *(_Invoker_type *)(local_b98._0_8_ + 0x18) = converted_2.fun_._M_invoker;
              if (converted_2.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
                *(undefined4 *)local_b98._0_8_ =
                     converted_2.fun_.super__Function_base._M_functor._0_4_;
                *(undefined4 *)(local_b98._0_8_ + 4) =
                     converted_2.fun_.super__Function_base._M_functor._4_4_;
                *(undefined4 *)(local_b98._0_8_ + 8) =
                     converted_2.fun_.super__Function_base._M_functor._8_4_;
                *(undefined4 *)(local_b98._0_8_ + 0xc) =
                     converted_2.fun_.super__Function_base._M_functor._12_4_;
                *(_Manager_type *)(local_b98._0_8_ + 0x10) =
                     converted_2.fun_.super__Function_base._M_manager;
              }
              local_b98._8_8_ = 0;
              local_b88._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_b88._8_8_ = std::_Function_handler::operator_cast_to_Action;
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                (*(code *)policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish)(policies,policies,3);
              }
              __l_06._M_len = 1;
              __l_06._M_array = (iterator)local_b98;
              std::
              vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
              ::vector((vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
                        *)&ret,__l_06,(allocator_type *)policies);
              if ((code *)local_b88._0_8_ != (code *)0x0) {
                (*(code *)local_b88._0_8_)(local_b98,local_b98,3);
              }
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(unsigned_short_&)> *)local_a00,
                         (ReturnAction *)&local_a40);
              local_ac8._0_8_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_ac8._8_8_ = 0;
              local_ad8._0_8_ = (pointer)0x0;
              local_ad8._8_8_ = 0;
              local_ad8._0_8_ = operator_new(0x38);
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)local_ad8._0_8_)->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 8))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ppuStack_a10;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x10))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_a08;
              local_a08 = (undefined1  [8])0x0;
              _ret = (undefined **)0x0;
              ppuStack_a10 = (undefined **)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x28))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x18))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x20))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x30))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_9f0._8_8_;
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9f0._M_allocated_capacity !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  *)(local_ad8._0_8_ + 0x18))->_M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_a00;
                ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  *)(local_ad8._0_8_ + 0x20))->_M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ppuStack_9f8;
                ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  *)(local_ad8._0_8_ + 0x28))->_M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_9f0._M_allocated_capacity;
                local_9f0._M_allocated_capacity = 0;
                local_9f0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              local_ad8._8_8_ = 0;
              local_ac8._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_ac8._8_8_ = std::_Function_handler::operator_cast_to_Action;
              std::
              vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
              ::~vector((vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
                         *)&ret);
              testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::
              WillOnce(pTVar26,(Action<ot::commissioner::Error_(unsigned_short_&)> *)local_ad8);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_ac8._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (*(code *)local_ac8._0_8_)(local_ad8,local_ad8,3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a40._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a40._M_string_length);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a98.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498.mMessage._M_dataplus._M_p != paVar4) {
                operator_delete(local_498.mMessage._M_dataplus._M_p);
              }
              local_b48._8_8_ = &PTR__MatcherBase_002dbb50;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b38._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b38._8_8_);
              }
              local_a78._M_unused._M_object = &PTR__MatcherBase_002dbb50;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._0_8_);
              }
              peVar15 = commissionerAppMocks[1].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_a78._8_8_ = operator_new(8);
              (((MatcherInterface<unsigned_short_&> *)local_a78._8_8_)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002de648;
              local_a78._M_unused._M_object = &PTR__MatcherBase_002dbb50;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<unsigned_short&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a68,
                         (MatcherInterface<unsigned_short_&> *)local_a78._8_8_);
              local_a78._M_unused._M_object = &PTR__MatcherBase_002dbb08;
              CommissionerAppMock::gmock_GetSessionId
                        ((MockSpec<ot::commissioner::Error_(unsigned_short_&)> *)local_b48,peVar15,
                         (Matcher<unsigned_short_&> *)&local_a78);
              testing::internal::GetWithoutMatchers();
              pJVar5 = &ctx.mJobManager;
              pTVar26 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
                        InternalExpectedAt((MockSpec<ot::commissioner::Error_(unsigned_short_&)> *)
                                           local_b48,
                                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                           ,0x28c,"*commissionerAppMocks[1]","GetSessionId(_)");
              paVar4 = &local_4c0.mMessage.field_2;
              local_4c0.mCode = kNone;
              local_4c0.mMessage._M_string_length = 0;
              local_4c0.mMessage.field_2._M_local_buf[0] = '\0';
              local_4c0.mMessage._M_dataplus._M_p = (pointer)paVar4;
              testing::Return<ot::commissioner::Error>((testing *)&local_a98,&local_4c0);
              local_a40._M_dataplus._M_p =
                   (pointer)local_a98.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              local_a40._M_string_length =
                   (size_type)
                   local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)
                   ((long)local_a98.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish + 8) =
                       *(_Atomic_word *)
                        ((long)local_a98.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)
                   ((long)local_a98.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish + 8) =
                       *(_Atomic_word *)
                        ((long)local_a98.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                }
              }
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)std::
                            _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:653:36)>
                            ::_M_manager;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)std::
                            _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:653:36)>
                            ::_M_invoke;
              std::function<void_(unsigned_short_&)>::function
                        ((function<void_(unsigned_short_&)> *)&converted_2,
                         (function<void_(unsigned_short_&)> *)policies);
              local_b88._0_8_ = 0;
              local_b88._8_8_ = 0;
              local_b98._0_8_ = (pointer)0x0;
              local_b98._8_8_ = 0;
              local_b98._0_8_ = operator_new(0x20);
              *(long *)local_b98._0_8_ = 0;
              *(long *)(local_b98._0_8_ + 8) = 0;
              *(long *)(local_b98._0_8_ + 0x10) = 0;
              *(_Invoker_type *)(local_b98._0_8_ + 0x18) = converted_2.fun_._M_invoker;
              if (converted_2.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
                *(undefined4 *)local_b98._0_8_ =
                     converted_2.fun_.super__Function_base._M_functor._0_4_;
                *(undefined4 *)(local_b98._0_8_ + 4) =
                     converted_2.fun_.super__Function_base._M_functor._4_4_;
                *(undefined4 *)(local_b98._0_8_ + 8) =
                     converted_2.fun_.super__Function_base._M_functor._8_4_;
                *(undefined4 *)(local_b98._0_8_ + 0xc) =
                     converted_2.fun_.super__Function_base._M_functor._12_4_;
                *(_Manager_type *)(local_b98._0_8_ + 0x10) =
                     converted_2.fun_.super__Function_base._M_manager;
              }
              local_b98._8_8_ = 0;
              local_b88._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_b88._8_8_ = std::_Function_handler::operator_cast_to_Action;
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                (*(code *)policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish)(policies,policies,3);
              }
              __l_07._M_len = 1;
              __l_07._M_array = (iterator)local_b98;
              std::
              vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
              ::vector((vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
                        *)&ret,__l_07,(allocator_type *)policies);
              if ((code *)local_b88._0_8_ != (code *)0x0) {
                (*(code *)local_b88._0_8_)(local_b98,local_b98,3);
              }
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(unsigned_short_&)> *)local_a00,
                         (ReturnAction *)&local_a40);
              local_ac8._0_8_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_ac8._8_8_ = 0;
              local_ad8._0_8_ = (pointer)0x0;
              local_ad8._8_8_ = 0;
              local_ad8._0_8_ = operator_new(0x38);
              ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)local_ad8._0_8_)->
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )_ret;
              ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)(local_ad8._0_8_ + 8))->
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )ppuStack_a10;
              ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_ad8._0_8_ + 0x10))->_M_t =
                   (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )local_a08;
              local_a08 = (undefined1  [8])0x0;
              _ret = (undefined **)0x0;
              ppuStack_a10 = (undefined **)0x0;
              ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_ad8._0_8_ + 0x28))->_M_t =
                   (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
              ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_ad8._0_8_ + 0x18))->_M_t =
                   (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
              ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_ad8._0_8_ + 0x20))->_M_t =
                   (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
              ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_ad8._0_8_ + 0x30))->
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   = (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      )local_9f0._8_8_;
              if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   )local_9f0._M_allocated_capacity !=
                  (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   )0x0) {
                ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  *)(local_ad8._0_8_ + 0x18))->
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     = (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )local_a00;
                ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  *)(local_ad8._0_8_ + 0x20))->
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     = (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )ppuStack_9f8;
                ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  *)(local_ad8._0_8_ + 0x28))->
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     = (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )local_9f0._M_allocated_capacity;
                local_9f0._M_allocated_capacity = 0;
                local_9f0._8_8_ =
                     (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      )0x0;
              }
              local_ad8._8_8_ = 0;
              local_ac8._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_ac8._8_8_ = std::_Function_handler::operator_cast_to_Action;
              std::
              vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
              ::~vector((vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
                         *)&ret);
              testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::
              WillOnce(pTVar26,(Action<ot::commissioner::Error_(unsigned_short_&)> *)local_ad8);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_ac8._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (*(code *)local_ac8._0_8_)(local_ad8,local_ad8,3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a40._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a40._M_string_length);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a98.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c0.mMessage._M_dataplus._M_p != paVar4) {
                operator_delete(local_4c0.mMessage._M_dataplus._M_p);
              }
              local_b48._8_8_ = &PTR__MatcherBase_002dbb50;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b38._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b38._8_8_);
              }
              local_a78._M_unused._M_object = &PTR__MatcherBase_002dbb50;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._0_8_);
              }
              ot::commissioner::JobManager::RunJobs(pJVar5);
              ot::commissioner::JobManager::CollectJobsValue((Value *)&ret,pJVar5);
              value.mError.mCode = _ret;
              std::__cxx11::string::operator=
                        ((string *)&value.mError.mMessage,(string *)&ppuStack_a10);
              std::__cxx11::string::operator=
                        ((string *)&value.mData,(string *)local_9f0._M_local_buf);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9f0._M_allocated_capacity !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9e0) {
                operator_delete((void *)local_9f0._M_allocated_capacity);
              }
              if (ppuStack_a10 != (undefined **)local_a00) {
                operator_delete(ppuStack_a10);
              }
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)&ret,&value);
              nlohmann::detail::input_adapter::
              input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                        ((input_adapter *)policies,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )_ret,(char *)((long)ppuStack_a10 + (long)_ret));
              local_5d8 = (code *)0x0;
              uStack_5d0 = 0;
              local_5e8._M_unused._M_object = (void *)0x0;
              local_5e8._8_8_ = 0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_668,(input_adapter *)policies,(parser_callback_t *)&local_5e8,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_668);
              jVar13 = json.m_value;
              vVar12 = json.m_type;
              json.m_type = local_668[0];
              local_668[0] = vVar12;
              json.m_value = local_660;
              local_660 = jVar13;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant(&json);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_668);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy
                        ((json_value *)
                         &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_668)->m_value,local_668[0]);
              if (local_5d8 != (code *)0x0) {
                (*local_5d8)(&local_5e8,&local_5e8,__destroy_functor);
              }
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           policies[0].mFlags.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
              }
              if (_ret != (undefined **)local_a08) {
                operator_delete(_ret);
              }
              bVar18 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000001");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[0].mRotationTime._0_1_ = bVar18;
              if (!bVar18) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x291,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if (_ret != (undefined **)local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000002");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x292,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if (_ret != (undefined **)local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&json,"0x0000000000000001");
              policies[0]._0_8_ = policies[0]._0_8_ & 0xffffffff00000000;
              testing::internal::
              CmpHelperEQ<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,int>
                        ((internal *)&ret,"json[\"0x0000000000000001\"]","0",pvVar25,(int *)policies
                        );
              if (ret == false) {
                testing::Message::Message((Message *)policies);
                if (ppuStack_a10 == (undefined **)0x0) {
                  pcVar31 = "";
                }
                else {
                  pcVar31 = *ppuStack_a10;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x293,pcVar31);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)policies);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                if (policies[0]._0_8_ != 0) {
                  (**(code **)(*(long *)policies[0]._0_8_ + 8))();
                }
              }
              ppuVar14 = ppuStack_a10;
              if (ppuStack_a10 != (undefined **)0x0) {
                if (*ppuStack_a10 != (pointer)((long)ppuStack_a10 + 0x10)) {
                  operator_delete(*ppuStack_a10);
                }
                operator_delete(ppuVar14);
              }
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&json,"0x0000000000000002");
              policies[0]._0_4_ = 1;
              testing::internal::
              CmpHelperEQ<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,int>
                        ((internal *)&ret,"json[\"0x0000000000000002\"]","1",pvVar25,(int *)policies
                        );
              if (ret == false) {
                testing::Message::Message((Message *)policies);
                if (ppuStack_a10 == (undefined **)0x0) {
                  pcVar31 = "";
                }
                else {
                  pcVar31 = *ppuStack_a10;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x294,pcVar31);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)policies);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                if (policies[0]._0_8_ != 0) {
                  (**(code **)(*(long *)policies[0]._0_8_ + 8))();
                }
              }
              ppuVar14 = ppuStack_a10;
              if (ppuStack_a10 != (undefined **)0x0) {
                if (*ppuStack_a10 != (pointer)((long)ppuStack_a10 + 0x10)) {
                  operator_delete(*ppuStack_a10);
                }
                operator_delete(ppuVar14);
              }
              ot::commissioner::JobManager::CleanupJobs(pJVar5);
              _ret = (undefined **)local_a08;
              std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"opdataset","");
              ppuStack_9f8 = (undefined **)(local_9f0._M_local_buf + 8);
              std::__cxx11::string::_M_construct<char_const*>((string *)&ppuStack_9f8,"get","");
              local_9d8 = local_9d0 + 8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d8,"active","");
              __l_08._M_len = 3;
              __l_08._M_array = (iterator)&ret;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&converted_2,__l_08,(allocator_type *)&local_a40);
              local_ad8._0_8_ = (pointer)0x1;
              local_ad8._8_8_ = 2;
              __l_09._M_len = 2;
              __l_09._M_array = (iterator)local_ad8;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b98,__l_09,
                         (allocator_type *)&local_a98);
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)policies,&ctx.mJobManager,(Expression *)&converted_2,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b98,false);
              local_a78._M_unused._M_member_pointer =
                   local_a78._M_unused._M_member_pointer & 0xffffffff00000000;
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)local_b48,
                         "ctx.mJobManager.PrepareJobs({\"opdataset\", \"get\", \"active\"}, {0x1, 0x2}, false).mCode"
                         ,"ErrorCode::kNone",(ErrorCode *)policies,
                         (ErrorCode *)local_a78._M_pod_data);
              if ((pointer *)
                  policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &policies[0].mFlags.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(policies[0].mFlags.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if ((long *)local_b98._0_8_ != (long *)0x0) {
                operator_delete((void *)local_b98._0_8_);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&converted_2);
              lVar29 = 0;
              do {
                if ((pointer)((long)&(((element_type *)(local_9d0 + 8))->
                                     super_MatcherDescriberInterface).
                                     _vptr_MatcherDescriberInterface + lVar29) !=
                    *(pointer *)((long)&local_9d8 + lVar29)) {
                  operator_delete(*(pointer *)((long)&local_9d8 + lVar29));
                }
                lVar29 = lVar29 + -0x20;
              } while (lVar29 != -0x60);
              if ((string)local_b48[0] == (string)0x0) {
                testing::Message::Message((Message *)&ret);
                if ((undefined **)local_b48._8_8_ == (undefined **)0x0) {
                  pcVar31 = "";
                }
                else {
                  pcVar31 = *(char **)local_b48._8_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)policies,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x298,pcVar31);
                testing::internal::AssertHelper::operator=((AssertHelper *)policies,(Message *)&ret)
                ;
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
                if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     )_ret != (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               )0x0) {
                  (**(code **)((long)*_ret + 8))();
                }
              }
              uVar9 = local_b48._8_8_;
              if ((undefined **)local_b48._8_8_ != (undefined **)0x0) {
                if (*(undefined ***)local_b48._8_8_ != (undefined **)(local_b48._8_8_ + 0x10)) {
                  operator_delete(*(undefined ***)local_b48._8_8_);
                }
                operator_delete((void *)uVar9);
              }
              peVar15 = commissionerAppMocks[0].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_a78._8_8_ = operator_new(8);
              (((MatcherInterface<ot::commissioner::ActiveOperationalDataset_&> *)local_a78._8_8_)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002de9e0;
              local_a78._M_unused._M_object = &PTR__MatcherBase_002dcba8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a68,
                         (MatcherInterface<ot::commissioner::ActiveOperationalDataset_&> *)
                         local_a78._8_8_);
              local_a78._M_unused._M_object = &PTR__MatcherBase_002dcb60;
              local_a40._M_string_length = (size_type)operator_new(8);
              (((MatcherInterface<const_unsigned_short_&> *)local_a40._M_string_length)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002dde18;
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002db4b0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_a40.field_2._M_allocated_capacity,
                         (MatcherInterface<const_unsigned_short_&> *)local_a40._M_string_length);
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002db468;
              CommissionerAppMock::gmock_GetActiveDataset
                        ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                          *)policies,peVar15,
                         (Matcher<ot::commissioner::ActiveOperationalDataset_&> *)&local_a78,
                         (Matcher<unsigned_short> *)&local_a40);
              testing::internal::GetWithoutMatchers();
              pTVar27 = testing::internal::
                        MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                                    *)policies,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x299,"*commissionerAppMocks[0]","GetActiveDataset(_, _)");
              paVar4 = &local_4e8.mMessage.field_2;
              local_4e8.mCode = kNone;
              local_4e8.mMessage._M_string_length = 0;
              local_4e8.mMessage.field_2._M_local_buf[0] = '\0';
              local_4e8.mMessage._M_dataplus._M_p = (pointer)paVar4;
              testing::Return<ot::commissioner::Error>((testing *)&local_ab0,&local_4e8);
              local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)local_aa8;
              if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_aa8->_M_use_count = local_aa8->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_aa8->_M_use_count = local_aa8->_M_use_count + 1;
                }
              }
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              converted_2.fun_.super__Function_base._M_manager =
                   std::
                   _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:666:37)>
                   ::_M_manager;
              converted_2.fun_._M_invoker =
                   std::
                   _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:666:37)>
                   ::_M_invoke;
              std::function<void_(ot::commissioner::ActiveOperationalDataset_&)>::function
                        ((function<void_(ot::commissioner::ActiveOperationalDataset_&)> *)local_b98,
                         &converted_2.fun_);
              local_b38._0_8_ = 0;
              local_b38._8_8_ = 0;
              local_b48._0_8_ = (pointer)0x0;
              local_b48._8_8_ = 0;
              local_b48._0_8_ = operator_new(0x20);
              *(undefined8 *)local_b48._0_8_ = 0;
              *(undefined8 *)(local_b48._0_8_ + 8) = 0;
              *(undefined8 *)(local_b48._0_8_ + 0x10) = 0;
              *(undefined8 *)(local_b48._0_8_ + 0x18) = local_b88._8_8_;
              if ((code *)local_b88._0_8_ != (code *)0x0) {
                *(undefined8 *)local_b48._0_8_ = local_b98._0_8_;
                *(undefined8 *)(local_b48._0_8_ + 8) = local_b98._8_8_;
                *(undefined8 *)(local_b48._0_8_ + 0x10) = local_b88._0_8_;
              }
              local_b48._8_8_ = 0;
              local_b38._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_b38._8_8_ = std::_Function_handler::operator_cast_to_Action;
              if (converted_2.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
                (*converted_2.fun_.super__Function_base._M_manager)
                          ((_Any_data *)&converted_2,(_Any_data *)&converted_2,__destroy_functor);
              }
              __l_10._M_len = 1;
              __l_10._M_array = (iterator)local_b48;
              std::
              vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
              ::vector((vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
                        *)&ret,__l_10,(allocator_type *)&converted_2);
              if ((code *)local_b38._0_8_ != (code *)0x0) {
                (*(code *)local_b38._0_8_)(local_b48,local_b48,3);
              }
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                          *)local_a00,(ReturnAction *)&local_a98);
              local_ac8._0_8_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_ac8._8_8_ = 0;
              local_ad8._0_8_ = (pointer)0x0;
              local_ad8._8_8_ = 0;
              local_ad8._0_8_ = operator_new(0x38);
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)local_ad8._0_8_)->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 8))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ppuStack_a10;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x10))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_a08;
              local_a08 = (undefined1  [8])0x0;
              _ret = (undefined **)0x0;
              ppuStack_a10 = (undefined **)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x28))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x18))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x20))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x30))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_9f0._8_8_;
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9f0._M_allocated_capacity !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  *)(local_ad8._0_8_ + 0x18))->_M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_a00;
                ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  *)(local_ad8._0_8_ + 0x20))->_M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ppuStack_9f8;
                ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  *)(local_ad8._0_8_ + 0x28))->_M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_9f0._M_allocated_capacity;
                local_9f0._M_allocated_capacity = 0;
                local_9f0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              local_ad8._8_8_ = 0;
              local_ac8._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_ac8._8_8_ = std::_Function_handler::operator_cast_to_Action;
              std::
              vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
              ::~vector((vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
                         *)&ret);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              ::WillOnce(pTVar27,(Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                                  *)local_ad8);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_ac8._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (*(code *)local_ac8._0_8_)(local_ad8,local_ad8,3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a98.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              }
              if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_aa8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8.mMessage._M_dataplus._M_p != paVar4) {
                operator_delete(local_4e8.mMessage._M_dataplus._M_p);
              }
              policies[1]._0_8_ = &PTR__MatcherBase_002dcba8;
              if (policies[1].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           policies[1].mFlags.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              }
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__MatcherBase_002db4b0;
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           policies[0].mFlags.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
              }
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002db4b0;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a40.field_2._M_allocated_capacity !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a40.field_2._M_allocated_capacity);
              }
              local_a78._M_unused._M_object = &PTR__MatcherBase_002dcba8;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._0_8_);
              }
              peVar15 = commissionerAppMocks[1].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_a78._8_8_ = operator_new(8);
              (((MatcherInterface<ot::commissioner::ActiveOperationalDataset_&> *)local_a78._8_8_)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002de9e0;
              local_a78._M_unused._M_object = &PTR__MatcherBase_002dcba8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a68,
                         (MatcherInterface<ot::commissioner::ActiveOperationalDataset_&> *)
                         local_a78._8_8_);
              local_a78._M_unused._M_object = &PTR__MatcherBase_002dcb60;
              local_a40._M_string_length = (size_type)operator_new(8);
              (((MatcherInterface<const_unsigned_short_&> *)local_a40._M_string_length)->
              super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002dde18;
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002db4b0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_a40.field_2._M_allocated_capacity,
                         (MatcherInterface<const_unsigned_short_&> *)local_a40._M_string_length);
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002db468;
              CommissionerAppMock::gmock_GetActiveDataset
                        ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                          *)policies,peVar15,
                         (Matcher<ot::commissioner::ActiveOperationalDataset_&> *)&local_a78,
                         (Matcher<unsigned_short> *)&local_a40);
              testing::internal::GetWithoutMatchers();
              pTVar27 = testing::internal::
                        MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                                    *)policies,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x29f,"*commissionerAppMocks[1]","GetActiveDataset(_, _)");
              paVar4 = &local_510.mMessage.field_2;
              local_510.mCode = kNone;
              local_510.mMessage._M_string_length = 0;
              local_510.mMessage.field_2._M_local_buf[0] = '\0';
              local_510.mMessage._M_dataplus._M_p = (pointer)paVar4;
              testing::Return<ot::commissioner::Error>((testing *)&local_ab0,&local_510);
              local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)local_aa8;
              if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_aa8->_M_use_count = local_aa8->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_aa8->_M_use_count = local_aa8->_M_use_count + 1;
                }
              }
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              converted_2.fun_.super__Function_base._M_manager =
                   std::
                   _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:672:37)>
                   ::_M_manager;
              converted_2.fun_._M_invoker =
                   std::
                   _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:672:37)>
                   ::_M_invoke;
              std::function<void_(ot::commissioner::ActiveOperationalDataset_&)>::function
                        ((function<void_(ot::commissioner::ActiveOperationalDataset_&)> *)local_b98,
                         &converted_2.fun_);
              local_b38._0_8_ = 0;
              local_b38._8_8_ = 0;
              local_b48._0_8_ = (pointer)0x0;
              local_b48._8_8_ = 0;
              local_b48._0_8_ = operator_new(0x20);
              *(undefined8 *)local_b48._0_8_ = 0;
              *(undefined8 *)(local_b48._0_8_ + 8) = 0;
              *(undefined8 *)(local_b48._0_8_ + 0x10) = 0;
              *(undefined8 *)(local_b48._0_8_ + 0x18) = local_b88._8_8_;
              if ((code *)local_b88._0_8_ != (code *)0x0) {
                *(undefined8 *)local_b48._0_8_ = local_b98._0_8_;
                *(undefined8 *)(local_b48._0_8_ + 8) = local_b98._8_8_;
                *(undefined8 *)(local_b48._0_8_ + 0x10) = local_b88._0_8_;
              }
              local_b48._8_8_ = 0;
              local_b38._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_b38._8_8_ = std::_Function_handler::operator_cast_to_Action;
              if (converted_2.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
                (*converted_2.fun_.super__Function_base._M_manager)
                          ((_Any_data *)&converted_2,(_Any_data *)&converted_2,__destroy_functor);
              }
              __l_11._M_len = 1;
              __l_11._M_array = (iterator)local_b48;
              std::
              vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
              ::vector((vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
                        *)&ret,__l_11,(allocator_type *)&converted_2);
              if ((code *)local_b38._0_8_ != (code *)0x0) {
                (*(code *)local_b38._0_8_)(local_b48,local_b48,3);
              }
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                          *)local_a00,(ReturnAction *)&local_a98);
              local_ac8._0_8_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_ac8._8_8_ = 0;
              local_ad8._0_8_ = (pointer)0x0;
              local_ad8._8_8_ = 0;
              local_ad8._0_8_ = operator_new(0x38);
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)local_ad8._0_8_)->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 8))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ppuStack_a10;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x10))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_a08;
              local_a08 = (undefined1  [8])0x0;
              _ret = (undefined **)0x0;
              ppuStack_a10 = (undefined **)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x28))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x18))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x20))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)(local_ad8._0_8_ + 0x30))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_9f0._8_8_;
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9f0._M_allocated_capacity !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  *)(local_ad8._0_8_ + 0x18))->_M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_a00;
                ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  *)(local_ad8._0_8_ + 0x20))->_M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ppuStack_9f8;
                ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  *)(local_ad8._0_8_ + 0x28))->_M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_9f0._M_allocated_capacity;
                local_9f0._M_allocated_capacity = 0;
                local_9f0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              local_ad8._8_8_ = (undefined8 *)0x0;
              local_ac8._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_ac8._8_8_ = std::_Function_handler::operator_cast_to_Action;
              std::
              vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
              ::~vector((vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
                         *)&ret);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              ::WillOnce(pTVar27,(Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                                  *)local_ad8);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_ac8._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (*(code *)local_ac8._0_8_)(local_ad8,local_ad8,3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a98.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              }
              if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_aa8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_510.mMessage._M_dataplus._M_p != paVar4) {
                operator_delete(local_510.mMessage._M_dataplus._M_p);
              }
              policies[1]._0_8_ = &PTR__MatcherBase_002dcba8;
              if (policies[1].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           policies[1].mFlags.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              }
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__MatcherBase_002db4b0;
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           policies[0].mFlags.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
              }
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002db4b0;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a40.field_2._M_allocated_capacity !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a40.field_2._M_allocated_capacity);
              }
              local_a78._M_unused._M_object = &PTR__MatcherBase_002dcba8;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._0_8_);
              }
              ot::commissioner::JobManager::RunJobs(&ctx.mJobManager);
              ot::commissioner::JobManager::CollectJobsValue((Value *)&ret,&ctx.mJobManager);
              value.mError.mCode = _ret;
              std::__cxx11::string::operator=
                        ((string *)&value.mError.mMessage,(string *)&ppuStack_a10);
              std::__cxx11::string::operator=
                        ((string *)&value.mData,(string *)local_9f0._M_local_buf);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9f0._M_allocated_capacity !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9e0) {
                operator_delete((void *)local_9f0._M_allocated_capacity);
              }
              if (ppuStack_a10 != (undefined **)local_a00) {
                operator_delete(ppuStack_a10);
              }
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)&ret,&value);
              nlohmann::detail::input_adapter::
              input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                        ((input_adapter *)policies,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )_ret,(char *)((long)ppuStack_a10 + (long)_ret));
              local_5f8 = (code *)0x0;
              uStack_5f0 = 0;
              local_608._M_unused._M_object = (void *)0x0;
              local_608._8_8_ = 0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_678,(input_adapter *)policies,(parser_callback_t *)&local_608,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_678);
              jVar13 = json.m_value;
              vVar12 = json.m_type;
              json.m_type = local_678[0];
              local_678[0] = vVar12;
              json.m_value = local_670;
              local_670 = jVar13;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant(&json);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_678);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy
                        ((json_value *)
                         &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_678)->m_value,local_678[0]);
              if (local_5f8 != (code *)0x0) {
                (*local_5f8)(&local_608,&local_608,__destroy_functor);
              }
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           policies[0].mFlags.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
              }
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_a08) {
                operator_delete(_ret);
              }
              bVar18 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000001");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[0].mRotationTime._0_1_ = bVar18;
              if (!bVar18) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2a8,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000002");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2a9,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&json,"0x0000000000000001");
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[6],_0>(pvVar25,(char (*) [6])0x25791a);
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json[\"0x0000000000000001\"].contains(\"PanId\")",
                           "false","true",pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2aa,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&json,"0x0000000000000002");
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[6],_0>(pvVar25,(char (*) [6])0x25791a);
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)policies,
                           (AssertionResult *)"json[\"0x0000000000000002\"].contains(\"PanId\")",
                           "false","true",pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2ab,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b98,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b98);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
                puVar10 = policies[0].mFlags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (*(pointer *)
                       policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                      policies[0].mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x10) {
                    operator_delete(*(pointer *)
                                     policies[0].mFlags.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(puVar10);
                }
              }
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&json,"0x0000000000000001");
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)pvVar25,"PanId");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::
              get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                         pvVar25);
              testing::internal::CmpHelperSTREQ
                        ((internal *)policies,"\"0x0001\"",
                         "json[\"0x0000000000000001\"][\"PanId\"].get<std::string>().c_str()",
                         "0x0001",(char *)_ret);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_a08) {
                operator_delete(_ret);
              }
              if ((char)policies[0].mRotationTime == '\0') {
                testing::Message::Message((Message *)&ret);
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start == (pointer)0x0) {
                  pcVar31 = "";
                }
                else {
                  pcVar31 = *(char **)policies[0].mFlags.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2ac,pcVar31);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&ret);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                     )_ret != (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )0x0) {
                  (**(code **)((long)*_ret + 8))();
                }
              }
              puVar10 = policies[0].mFlags.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                if (*(pointer *)
                     policies[0].mFlags.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start !=
                    policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start + 0x10) {
                  operator_delete(*(pointer *)
                                   policies[0].mFlags.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                }
                operator_delete(puVar10);
              }
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&json,"0x0000000000000002");
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)pvVar25,"PanId");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::
              get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                         pvVar25);
              testing::internal::CmpHelperSTREQ
                        ((internal *)policies,"\"0x0002\"",
                         "json[\"0x0000000000000002\"][\"PanId\"].get<std::string>().c_str()",
                         "0x0002",(char *)_ret);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_a08) {
                operator_delete(_ret);
              }
              if ((char)policies[0].mRotationTime == '\0') {
                testing::Message::Message((Message *)&ret);
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start == (pointer)0x0) {
                  pcVar31 = "";
                }
                else {
                  pcVar31 = *(char **)policies[0].mFlags.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2ad,pcVar31);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&ret);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                     )_ret != (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )0x0) {
                  (**(code **)((long)*_ret + 8))();
                }
              }
              puVar10 = policies[0].mFlags.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (policies[0].mFlags.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                if (*(pointer *)
                     policies[0].mFlags.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start !=
                    policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start + 0x10) {
                  operator_delete(*(pointer *)
                                   policies[0].mFlags.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                }
                operator_delete(puVar10);
              }
              ot::commissioner::JobManager::CleanupJobs(&ctx.mJobManager);
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[1].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[1].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[1].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              _ret = (undefined **)local_a08;
              std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"opdataset","");
              ppuStack_9f8 = (undefined **)(local_9f0._M_local_buf + 8);
              std::__cxx11::string::_M_construct<char_const*>((string *)&ppuStack_9f8,"set","");
              local_9d8 = (undefined *)(local_9d0 + 8);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_9d8,"securitypolicy","");
              local_9b8[0] = local_9a8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_9b8,"3","");
              local_998[0]._M_p = local_988;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_998,"AB","");
              __l_12._M_len = 5;
              __l_12._M_array = (iterator)&ret;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_b98,__l_12,(allocator_type *)&local_a98);
              local_a78._M_unused._M_member_pointer = 1;
              local_a78._8_8_ = (element_type *)0x2;
              __l_13._M_len = 2;
              __l_13._M_array = (iterator)&local_a78;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b48,__l_13,
                         (allocator_type *)&local_ab0);
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)&converted_2,&ctx.mJobManager,(Expression *)local_b98,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b48,false);
              local_a40._M_dataplus._M_p = local_a40._M_dataplus._M_p & 0xffffffff00000000;
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)local_ad8,
                         "ctx.mJobManager.PrepareJobs({\"opdataset\", \"set\", \"securitypolicy\", \"3\", \"AB\"}, {0x1, 0x2}, false).mCode"
                         ,"ErrorCode::kNone",(ErrorCode *)&converted_2,(ErrorCode *)&local_a40);
              if ((_Invoker_type *)converted_2.fun_.super__Function_base._M_functor._8_8_ !=
                  &converted_2.fun_._M_invoker) {
                operator_delete((void *)converted_2.fun_.super__Function_base._M_functor._8_8_);
              }
              if ((pointer)local_b48._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_b48._0_8_);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_b98);
              lVar29 = 0;
              do {
                pcVar31 = *(char **)((long)&local_998[0]._M_p + lVar29);
                if (local_988 + lVar29 != pcVar31) {
                  operator_delete(pcVar31);
                }
                lVar29 = lVar29 + -0x20;
              } while (lVar29 != -0xa0);
              if ((ReturnAction)local_ad8[0] == (ReturnAction)0x0) {
                testing::Message::Message((Message *)&ret);
                if ((undefined8 *)local_ad8._8_8_ == (undefined8 *)0x0) {
                  pcVar31 = "";
                }
                else {
                  pcVar31 = *(char **)local_ad8._8_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2b3,pcVar31);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&ret);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )_ret != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                  (**(code **)((long)*_ret + 8))();
                }
              }
              uVar9 = local_ad8._8_8_;
              if ((undefined8 *)local_ad8._8_8_ != (undefined8 *)0x0) {
                if (*(undefined8 **)local_ad8._8_8_ != (undefined8 *)(local_ad8._8_8_ + 0x10)) {
                  operator_delete(*(undefined8 **)local_ad8._8_8_);
                }
                operator_delete((void *)uVar9);
              }
              peVar15 = commissionerAppMocks[0].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_a40._M_string_length = (size_type)operator_new(8);
              (((MatcherInterface<const_ot::commissioner::SecurityPolicy_&> *)
               local_a40._M_string_length)->super_MatcherDescriberInterface).
              _vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002decd0;
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002dcaa8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<ot::commissioner::SecurityPolicy_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_a40.field_2._M_allocated_capacity,
                         (MatcherInterface<const_ot::commissioner::SecurityPolicy_&> *)
                         local_a40._M_string_length);
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002dca60;
              CommissionerAppMock::gmock_SetSecurityPolicy
                        ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                          *)local_ad8,peVar15,
                         (Matcher<const_ot::commissioner::SecurityPolicy_&> *)&local_a40);
              testing::internal::GetWithoutMatchers();
              pTVar28 = testing::internal::
                        MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                        ::InternalExpectedAt
                                  ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                                    *)local_ad8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x2b4,"*commissionerAppMocks[0]","SetSecurityPolicy(_)");
              paVar4 = &local_538.mMessage.field_2;
              local_538.mCode = kNone;
              local_538.mMessage._M_string_length = 0;
              local_538.mMessage.field_2._M_local_buf[0] = '\0';
              local_538.mMessage._M_dataplus._M_p = (pointer)paVar4;
              testing::Return<ot::commissioner::Error>((testing *)&local_ab0,&local_538);
              local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)local_aa8;
              if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_aa8->_M_use_count = local_aa8->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_aa8->_M_use_count = local_aa8->_M_use_count + 1;
                }
              }
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              converted_2.fun_.super__Function_base._M_manager =
                   std::
                   _Function_handler<void_(const_ot::commissioner::SecurityPolicy_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:693:37)>
                   ::_M_manager;
              converted_2.fun_._M_invoker =
                   std::
                   _Function_handler<void_(const_ot::commissioner::SecurityPolicy_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:693:37)>
                   ::_M_invoke;
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object = policies;
              local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)policies;
              std::function<void_(const_ot::commissioner::SecurityPolicy_&)>::function
                        ((function<void_(const_ot::commissioner::SecurityPolicy_&)> *)local_b98,
                         (function<void_(const_ot::commissioner::SecurityPolicy_&)> *)&converted_2);
              local_b38._0_8_ = 0;
              local_b38._8_8_ = 0;
              local_b48._0_8_ = (pointer)0x0;
              local_b48._8_8_ = 0;
              local_b48._0_8_ = operator_new(0x20);
              *(undefined8 *)local_b48._0_8_ = 0;
              *(undefined8 *)(local_b48._0_8_ + 8) = 0;
              *(undefined8 *)(local_b48._0_8_ + 0x10) = 0;
              *(undefined8 *)(local_b48._0_8_ + 0x18) = local_b88._8_8_;
              if ((code *)local_b88._0_8_ != (code *)0x0) {
                *(undefined8 *)local_b48._0_8_ = local_b98._0_8_;
                *(undefined8 *)(local_b48._0_8_ + 8) = local_b98._8_8_;
                *(undefined8 *)(local_b48._0_8_ + 0x10) = local_b88._0_8_;
              }
              local_b48._8_8_ = 0;
              local_b38._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_b38._8_8_ = std::_Function_handler::operator_cast_to_Action;
              if (converted_2.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
                (*converted_2.fun_.super__Function_base._M_manager)
                          ((_Any_data *)&converted_2,(_Any_data *)&converted_2,__destroy_functor);
              }
              __l_14._M_len = 1;
              __l_14._M_array = (iterator)local_b48;
              std::
              vector<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>,_std::allocator<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_>_>
              ::vector((vector<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>,_std::allocator<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_>_>
                        *)&ret,__l_14,(allocator_type *)&converted_2);
              if ((code *)local_b38._0_8_ != (code *)0x0) {
                (*(code *)local_b38._0_8_)(local_b48,local_b48,3);
              }
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                          *)local_a00,(ReturnAction *)&local_a98);
              local_a68._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_a68._8_8_ = 0;
              local_a78._M_unused._M_object = (pointer)0x0;
              local_a78._8_8_ = (element_type *)0x0;
              local_a78._M_unused._M_object = operator_new(0x38);
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)local_a78._M_unused._0_8_)->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)((long)local_a78._M_unused._0_8_ + 8))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ppuStack_a10;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)((long)local_a78._M_unused._0_8_ + 0x10))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_a08;
              local_a08 = (undefined1  [8])0x0;
              _ret = (undefined **)0x0;
              ppuStack_a10 = (undefined **)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)((long)local_a78._M_unused._0_8_ + 0x28))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)((long)local_a78._M_unused._0_8_ + 0x18))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)((long)local_a78._M_unused._0_8_ + 0x20))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)((long)local_a78._M_unused._0_8_ + 0x30))->_M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_9f0._8_8_;
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9f0._M_allocated_capacity !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  *)((long)local_a78._M_unused._0_8_ + 0x18))->_M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_a00;
                ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  *)((long)local_a78._M_unused._0_8_ + 0x20))->_M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ppuStack_9f8;
                ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  *)((long)local_a78._M_unused._0_8_ + 0x28))->_M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_9f0._M_allocated_capacity;
                local_9f0._M_allocated_capacity = 0;
                local_9f0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              local_a78._8_8_ = (element_type *)0x0;
              local_a68._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_a68._8_8_ = std::_Function_handler::operator_cast_to_Action;
              std::
              vector<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>,_std::allocator<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_>_>
              ::~vector((vector<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>,_std::allocator<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_>_>
                         *)&ret);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::
              WillOnce(pTVar28,(Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                                *)&local_a78);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                (*(code *)local_a68._0_8_)(&local_a78,&local_a78,3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a98.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              }
              if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_aa8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_538.mMessage._M_dataplus._M_p != paVar4) {
                operator_delete(local_538.mMessage._M_dataplus._M_p);
              }
              local_ad8._8_8_ = &PTR__MatcherBase_002dcaa8;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac8._8_8_);
              }
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002dcaa8;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a40.field_2._M_allocated_capacity !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a40.field_2._M_allocated_capacity);
              }
              peVar15 = commissionerAppMocks[1].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_a40._M_string_length = (size_type)operator_new(8);
              (((MatcherInterface<const_ot::commissioner::SecurityPolicy_&> *)
               local_a40._M_string_length)->super_MatcherDescriberInterface).
              _vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherDescriberInterface_002decd0;
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002dcaa8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<testing::MatcherInterface<ot::commissioner::SecurityPolicy_const&>const*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_a40.field_2._M_allocated_capacity,
                         (MatcherInterface<const_ot::commissioner::SecurityPolicy_&> *)
                         local_a40._M_string_length);
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002dca60;
              CommissionerAppMock::gmock_SetSecurityPolicy
                        ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                          *)local_ad8,peVar15,
                         (Matcher<const_ot::commissioner::SecurityPolicy_&> *)&local_a40);
              testing::internal::GetWithoutMatchers();
              pTVar28 = testing::internal::
                        MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                        ::InternalExpectedAt
                                  ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                                    *)local_ad8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x2b6,"*commissionerAppMocks[1]","SetSecurityPolicy(_)");
              paVar4 = &local_560.mMessage.field_2;
              local_560.mCode = kNone;
              local_560.mMessage._M_string_length = 0;
              local_560.mMessage.field_2._M_local_buf[0] = '\0';
              local_560.mMessage._M_dataplus._M_p = (pointer)paVar4;
              testing::Return<ot::commissioner::Error>((testing *)&local_ab0,&local_560);
              local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)CONCAT71(uStack_aaf,local_ab0);
              local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)local_aa8;
              if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_aa8->_M_use_count = local_aa8->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_aa8->_M_use_count = local_aa8->_M_use_count + 1;
                }
              }
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              converted_2.fun_.super__Function_base._M_manager =
                   std::
                   _Function_handler<void_(const_ot::commissioner::SecurityPolicy_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:695:37)>
                   ::_M_manager;
              converted_2.fun_._M_invoker =
                   std::
                   _Function_handler<void_(const_ot::commissioner::SecurityPolicy_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:695:37)>
                   ::_M_invoke;
              converted_2.fun_.super__Function_base._M_functor._M_unused._0_8_ = policies;
              local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)policies;
              std::function<void_(const_ot::commissioner::SecurityPolicy_&)>::function
                        ((function<void_(const_ot::commissioner::SecurityPolicy_&)> *)local_b98,
                         (function<void_(const_ot::commissioner::SecurityPolicy_&)> *)&converted_2);
              local_b38._0_8_ = 0;
              local_b38._8_8_ = 0;
              local_b48._0_8_ = (pointer)0x0;
              local_b48._8_8_ = 0;
              local_b48._0_8_ = operator_new(0x20);
              pJVar5 = &ctx.mJobManager;
              *(undefined8 *)local_b48._0_8_ = 0;
              *(undefined8 *)(local_b48._0_8_ + 8) = 0;
              *(undefined8 *)(local_b48._0_8_ + 0x10) = 0;
              *(undefined8 *)(local_b48._0_8_ + 0x18) = local_b88._8_8_;
              if ((code *)local_b88._0_8_ != (code *)0x0) {
                *(undefined8 *)local_b48._0_8_ = local_b98._0_8_;
                *(undefined8 *)(local_b48._0_8_ + 8) = local_b98._8_8_;
                *(undefined8 *)(local_b48._0_8_ + 0x10) = local_b88._0_8_;
              }
              local_b48._8_8_ = 0;
              local_b38._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_b38._8_8_ = std::_Function_handler::operator_cast_to_Action;
              if (converted_2.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
                (*converted_2.fun_.super__Function_base._M_manager)
                          ((_Any_data *)&converted_2,(_Any_data *)&converted_2,__destroy_functor);
              }
              __l_15._M_len = 1;
              __l_15._M_array = (iterator)local_b48;
              std::
              vector<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>,_std::allocator<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_>_>
              ::vector((vector<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>,_std::allocator<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_>_>
                        *)&ret,__l_15,(allocator_type *)&converted_2);
              if ((code *)local_b38._0_8_ != (code *)0x0) {
                (*(code *)local_b38._0_8_)(local_b48,local_b48,3);
              }
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                          *)local_a00,(ReturnAction *)&local_a98);
              local_a68._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_a68._8_8_ = 0;
              local_a78._M_unused._M_object = (pointer)0x0;
              local_a78._8_8_ = (element_type *)0x0;
              local_a78._M_unused._M_object = operator_new(0x38);
              ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)local_a78._M_unused._0_8_)->
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )_ret;
              ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)((long)local_a78._M_unused._0_8_ + 8))->
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )ppuStack_a10;
              ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)local_a78._M_unused._0_8_ + 0x10))->_M_t =
                   (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )local_a08;
              local_a08 = (undefined1  [8])0x0;
              _ret = (undefined **)0x0;
              ppuStack_a10 = (undefined **)0x0;
              ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)local_a78._M_unused._0_8_ + 0x28))->_M_t =
                   (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
              ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)local_a78._M_unused._0_8_ + 0x18))->_M_t =
                   (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
              ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)local_a78._M_unused._0_8_ + 0x20))->_M_t =
                   (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
              ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)local_a78._M_unused._0_8_ + 0x30))->
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   = (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      )local_9f0._8_8_;
              if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   )local_9f0._M_allocated_capacity !=
                  (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   )0x0) {
                ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  *)((long)local_a78._M_unused._0_8_ + 0x18))->
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     = (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )local_a00;
                ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  *)((long)local_a78._M_unused._0_8_ + 0x20))->
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     = (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )ppuStack_9f8;
                ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  *)((long)local_a78._M_unused._0_8_ + 0x28))->
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     = (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )local_9f0._M_allocated_capacity;
                local_9f0._M_allocated_capacity = 0;
                local_9f0._8_8_ =
                     (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      )0x0;
              }
              local_a78._8_8_ = (element_type *)0x0;
              local_a68._0_8_ = std::_Function_handler::operator_cast_to_Action;
              local_a68._8_8_ = std::_Function_handler::operator_cast_to_Action;
              std::
              vector<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>,_std::allocator<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_>_>
              ::~vector((vector<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>,_std::allocator<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_>_>
                         *)&ret);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::
              WillOnce(pTVar28,(Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                                *)&local_a78);
              pp_Var3 = &converted_2.fun_.super__Function_base._M_manager;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                (*(code *)local_a68._0_8_)(&local_a78,&local_a78,3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a98.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              }
              if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_aa8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_560.mMessage._M_dataplus._M_p != paVar4) {
                operator_delete(local_560.mMessage._M_dataplus._M_p);
              }
              local_ad8._8_8_ = &PTR__MatcherBase_002dcaa8;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac8._8_8_);
              }
              local_a40._M_dataplus._M_p = (pointer)&PTR__MatcherBase_002dcaa8;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a40.field_2._M_allocated_capacity !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a40.field_2._M_allocated_capacity);
              }
              ot::commissioner::JobManager::RunJobs(pJVar5);
              ot::commissioner::JobManager::CollectJobsValue((Value *)&ret,pJVar5);
              value.mError.mCode = _ret;
              std::__cxx11::string::operator=
                        ((string *)&value.mError.mMessage,(string *)&ppuStack_a10);
              std::__cxx11::string::operator=
                        ((string *)&value.mData,(string *)local_9f0._M_local_buf);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9f0._M_allocated_capacity !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9e0) {
                operator_delete((void *)local_9f0._M_allocated_capacity);
              }
              if (ppuStack_a10 != (undefined **)local_a00) {
                operator_delete(ppuStack_a10);
              }
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)&ret,&value);
              nlohmann::detail::input_adapter::
              input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                        ((input_adapter *)&converted_2,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )_ret,(char *)((long)ppuStack_a10 + (long)_ret));
              local_618 = (code *)0x0;
              uStack_610 = 0;
              local_628._M_unused._M_object = (void *)0x0;
              local_628._8_8_ = 0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_688,(input_adapter *)&converted_2,(parser_callback_t *)&local_628,
                      true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_688);
              jVar13 = json.m_value;
              vVar12 = json.m_type;
              json.m_type = local_688[0];
              local_688[0] = vVar12;
              json.m_value = local_680;
              local_680 = jVar13;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant(&json);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_688);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy
                        ((json_value *)
                         &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_688)->m_value,local_688[0]);
              if (local_618 != (code *)0x0) {
                (*local_618)(&local_628,&local_628,__destroy_functor);
              }
              if (converted_2.fun_.super__Function_base._M_functor._8_8_ != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           converted_2.fun_.super__Function_base._M_functor._8_8_);
              }
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_a08) {
                operator_delete(_ret);
              }
              bVar18 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000001");
              converted_2.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar18;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (!bVar18) {
                testing::Message::Message((Message *)local_b98);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)&converted_2,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b48,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,699,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b48,(Message *)local_b98);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b48);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if ((long *)local_b98._0_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_b98._0_8_ + 8))();
                }
                uVar9 = converted_2.fun_.super__Function_base._M_functor._8_8_;
                if (converted_2.fun_.super__Function_base._M_functor._8_8_ != 0) {
                  if (*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_ !=
                      (void *)(converted_2.fun_.super__Function_base._M_functor._8_8_ + 0x10)) {
                    operator_delete(*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_
                                   );
                  }
                  operator_delete((void *)uVar9);
                }
              }
              bVar18 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000002");
              converted_2.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar18;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (!bVar18) {
                testing::Message::Message((Message *)local_b98);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)&converted_2,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b48,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,700,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b48,(Message *)local_b98);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b48);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if ((long *)local_b98._0_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_b98._0_8_ + 8))();
                }
                uVar9 = converted_2.fun_.super__Function_base._M_functor._8_8_;
                if (converted_2.fun_.super__Function_base._M_functor._8_8_ != 0) {
                  if (*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_ !=
                      (void *)(converted_2.fun_.super__Function_base._M_functor._8_8_ + 0x10)) {
                    operator_delete(*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_
                                   );
                  }
                  operator_delete((void *)uVar9);
                }
              }
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&json,"0x0000000000000001");
              nlohmann::detail::
              from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        (pvVar25,&ret);
              converted_2.fun_.super__Function_base._M_functor._M_pod_data[0] = ret;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (ret == false) {
                testing::Message::Message((Message *)local_b98);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)&converted_2,
                           (AssertionResult *)"json[\"0x0000000000000001\"]","false","true",pcVar30)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b48,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2bd,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b48,(Message *)local_b98);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b48);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if ((long *)local_b98._0_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_b98._0_8_ + 8))();
                }
                uVar9 = converted_2.fun_.super__Function_base._M_functor._8_8_;
                if (converted_2.fun_.super__Function_base._M_functor._8_8_ != 0) {
                  if (*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_ !=
                      (void *)(converted_2.fun_.super__Function_base._M_functor._8_8_ + 0x10)) {
                    operator_delete(*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_
                                   );
                  }
                  operator_delete((void *)uVar9);
                }
              }
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&json,"0x0000000000000002");
              nlohmann::detail::
              from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        (pvVar25,&ret);
              converted_2.fun_.super__Function_base._M_functor._M_pod_data[0] = ret;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (ret == false) {
                testing::Message::Message((Message *)local_b98);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)&converted_2,
                           (AssertionResult *)"json[\"0x0000000000000002\"]","false","true",pcVar30)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b48,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2be,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b48,(Message *)local_b98);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b48);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if ((long *)local_b98._0_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_b98._0_8_ + 8))();
                }
                uVar9 = converted_2.fun_.super__Function_base._M_functor._8_8_;
                if (converted_2.fun_.super__Function_base._M_functor._8_8_ != 0) {
                  if (*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_ !=
                      (void *)(converted_2.fun_.super__Function_base._M_functor._8_8_ + 0x10)) {
                    operator_delete(*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_
                                   );
                  }
                  operator_delete((void *)uVar9);
                }
              }
              ot::commissioner::JobManager::CleanupJobs(pJVar5);
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object = pp_Var3;
              std::__cxx11::string::_M_construct<char_const*>((string *)&converted_2,"stop","");
              __l_16._M_len = 1;
              __l_16._M_array = (iterator)&converted_2;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_b98,__l_16,(allocator_type *)&local_a98);
              local_a78._M_unused._M_member_pointer = 1;
              local_a78._8_8_ = (element_type *)0x2;
              __l_17._M_len = 2;
              __l_17._M_array = (iterator)&local_a78;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b48,__l_17,
                         (allocator_type *)&local_ab0);
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)&ret,pJVar5,(Expression *)local_b98,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b48,false);
              local_a40._M_dataplus._M_p = local_a40._M_dataplus._M_p & 0xffffffff00000000;
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)local_ad8,
                         "ctx.mJobManager.PrepareJobs({\"stop\"}, {0x1, 0x2}, false).mCode",
                         "ErrorCode::kNone",(ErrorCode *)&ret,(ErrorCode *)&local_a40);
              if (ppuStack_a10 != (undefined **)local_a00) {
                operator_delete(ppuStack_a10);
              }
              if ((pointer)local_b48._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_b48._0_8_);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_b98);
              if ((_Manager_type *)converted_2.fun_.super__Function_base._M_functor._M_unused._0_8_
                  != pp_Var3) {
                operator_delete(converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                               );
              }
              if ((ReturnAction)local_ad8[0] == (ReturnAction)0x0) {
                testing::Message::Message((Message *)&ret);
                if ((undefined **)local_ad8._8_8_ == (undefined **)0x0) {
                  pcVar31 = "";
                }
                else {
                  pcVar31 = *(char **)local_ad8._8_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2c2,pcVar31);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&ret);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x0) {
                  (**(code **)(*_ret + 8))();
                }
              }
              uVar9 = local_ad8._8_8_;
              if ((undefined **)local_ad8._8_8_ != (undefined **)0x0) {
                if (*(undefined ***)local_ad8._8_8_ != (undefined **)(local_ad8._8_8_ + 0x10)) {
                  operator_delete(*(undefined ***)local_ad8._8_8_);
                }
                operator_delete((void *)uVar9);
              }
              pFVar2 = &(commissionerAppMocks[0].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->gmock00_Stop_79;
              testing::internal::UntypedFunctionMockerBase::RegisterOwner
                        (&pFVar2->super_UntypedFunctionMockerBase,
                         commissionerAppMocks[0].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ;
              _ret = (undefined **)pFVar2;
              testing::internal::GetWithoutMatchers();
              testing::internal::MockSpec<void_()>::InternalExpectedAt
                        ((MockSpec<void_()> *)&ret,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x2c3,"*commissionerAppMocks[0]","Stop()");
              pFVar2 = &(commissionerAppMocks[1].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->gmock00_Stop_79;
              testing::internal::UntypedFunctionMockerBase::RegisterOwner
                        (&pFVar2->super_UntypedFunctionMockerBase,
                         commissionerAppMocks[1].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ;
              _ret = (undefined **)pFVar2;
              testing::internal::GetWithoutMatchers();
              testing::internal::MockSpec<void_()>::InternalExpectedAt
                        ((MockSpec<void_()> *)&ret,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x2c4,"*commissionerAppMocks[1]","Stop()");
              ot::commissioner::JobManager::RunJobs(pJVar5);
              ot::commissioner::JobManager::CollectJobsValue((Value *)&ret,pJVar5);
              value.mError.mCode = _ret;
              std::__cxx11::string::operator=
                        ((string *)&value.mError.mMessage,(string *)&ppuStack_a10);
              std::__cxx11::string::operator=
                        ((string *)&value.mData,(string *)local_9f0._M_local_buf);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9f0._M_allocated_capacity !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9e0) {
                operator_delete((void *)local_9f0._M_allocated_capacity);
              }
              if (ppuStack_a10 != (undefined **)local_a00) {
                operator_delete(ppuStack_a10);
              }
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)&ret,&value);
              nlohmann::detail::input_adapter::
              input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                        ((input_adapter *)&converted_2,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )_ret,(char *)((long)ppuStack_a10 + (long)_ret));
              local_638 = (code *)0x0;
              uStack_630 = 0;
              local_648._M_unused._M_object = (void *)0x0;
              local_648._8_8_ = 0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_698,(input_adapter *)&converted_2,(parser_callback_t *)&local_648,
                      true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_698);
              jVar13 = json.m_value;
              vVar12 = json.m_type;
              json.m_type = local_698[0];
              local_698[0] = vVar12;
              json.m_value = local_690;
              local_690 = jVar13;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant(&json);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_698);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy
                        ((json_value *)
                         &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_698)->m_value,local_698[0]);
              if (local_638 != (code *)0x0) {
                (*local_638)(&local_648,&local_648,__destroy_functor);
              }
              if (converted_2.fun_.super__Function_base._M_functor._8_8_ != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           converted_2.fun_.super__Function_base._M_functor._8_8_);
              }
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_a08) {
                operator_delete(_ret);
              }
              bVar18 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000001");
              converted_2.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar18;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (!bVar18) {
                testing::Message::Message((Message *)local_b98);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)&converted_2,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b48,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2c8,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b48,(Message *)local_b98);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b48);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if ((long *)local_b98._0_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_b98._0_8_ + 8))();
                }
                uVar9 = converted_2.fun_.super__Function_base._M_functor._8_8_;
                if (converted_2.fun_.super__Function_base._M_functor._8_8_ != 0) {
                  if (*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_ !=
                      (void *)(converted_2.fun_.super__Function_base._M_functor._8_8_ + 0x10)) {
                    operator_delete(*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_
                                   );
                  }
                  operator_delete((void *)uVar9);
                }
              }
              bVar18 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000002");
              converted_2.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar18;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (!bVar18) {
                testing::Message::Message((Message *)local_b98);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)&converted_2,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b48,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2c9,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b48,(Message *)local_b98);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b48);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if ((long *)local_b98._0_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_b98._0_8_ + 8))();
                }
                uVar9 = converted_2.fun_.super__Function_base._M_functor._8_8_;
                if (converted_2.fun_.super__Function_base._M_functor._8_8_ != 0) {
                  if (*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_ !=
                      (void *)(converted_2.fun_.super__Function_base._M_functor._8_8_ + 0x10)) {
                    operator_delete(*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_
                                   );
                  }
                  operator_delete((void *)uVar9);
                }
              }
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&json,"0x0000000000000001");
              nlohmann::detail::
              from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        (pvVar25,&ret);
              converted_2.fun_.super__Function_base._M_functor._M_pod_data[0] = ret;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (ret == false) {
                testing::Message::Message((Message *)local_b98);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)&converted_2,
                           (AssertionResult *)"json[\"0x0000000000000001\"]","false","true",pcVar30)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b48,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2ca,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b48,(Message *)local_b98);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b48);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if ((long *)local_b98._0_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_b98._0_8_ + 8))();
                }
                uVar9 = converted_2.fun_.super__Function_base._M_functor._8_8_;
                if (converted_2.fun_.super__Function_base._M_functor._8_8_ != 0) {
                  if (*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_ !=
                      (void *)(converted_2.fun_.super__Function_base._M_functor._8_8_ + 0x10)) {
                    operator_delete(*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_
                                   );
                  }
                  operator_delete((void *)uVar9);
                }
              }
              pvVar25 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&json,"0x0000000000000002");
              nlohmann::detail::
              from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        (pvVar25,&ret);
              converted_2.fun_.super__Function_base._M_functor._M_pod_data[0] = ret;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (ret == false) {
                testing::Message::Message((Message *)local_b98);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ret,(internal *)&converted_2,
                           (AssertionResult *)"json[\"0x0000000000000002\"]","false","true",pcVar30)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b48,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2cb,(char *)_ret);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b48,(Message *)local_b98);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b48);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_ret
                    != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08) {
                  operator_delete(_ret);
                }
                if ((long *)local_b98._0_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_b98._0_8_ + 8))();
                }
                uVar9 = converted_2.fun_.super__Function_base._M_functor._8_8_;
                if (converted_2.fun_.super__Function_base._M_functor._8_8_ != 0) {
                  if (*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_ !=
                      (void *)(converted_2.fun_.super__Function_base._M_functor._8_8_ + 0x10)) {
                    operator_delete(*(void **)converted_2.fun_.super__Function_base._M_functor._8_8_
                                   );
                  }
                  operator_delete((void *)uVar9);
                }
              }
              ot::commissioner::JobManager::CleanupJobs(pJVar5);
              lVar29 = 0x28;
              do {
                pvVar8 = *(void **)((long)&policies[0].mRotationTime + lVar29);
                if (pvVar8 != (void *)0x0) {
                  operator_delete(pvVar8);
                }
                lVar29 = lVar29 + -0x20;
              } while (lVar29 != -0x18);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant(&json);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&json.m_value.boolean,json.m_type);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)value.mData._M_dataplus._M_p != &value.mData.field_2) {
                operator_delete(value.mData._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)value.mError.mMessage._M_dataplus._M_p != &value.mError.mMessage.field_2) {
                operator_delete(value.mError.mMessage._M_dataplus._M_p);
              }
              lVar29 = 0x30;
              do {
                if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_890 + lVar29)
                    != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                              ((long)&uStack_890 + lVar29));
                }
                lVar29 = lVar29 + -0x10;
              } while (lVar29 != 0);
              goto LAB_00137f02;
            }
            testing::Message::Message((Message *)&ret);
            pp_Var32 = (_func_int **)0x26a8b5;
            if (local_aa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              pp_Var32 = local_aa8->_vptr__Sp_counted_base;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&value,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x256,(char *)pp_Var32);
            testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&ret);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
            if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )_ret != (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           )0x0) {
              (**(code **)(*_ret + 8))();
            }
            if (local_aa8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00137f02;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_aa8->_vptr__Sp_counted_base !=
                local_aa8 + 1) {
              operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              local_aa8->_vptr__Sp_counted_base);
            }
          }
        }
      }
    }
  }
  operator_delete(local_aa8);
LAB_00137f02:
  JobManagerTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(JobManagerTestSuite, BuildFinalResultString)
{
    TestContext ctx;
    SetInitialExpectations(ctx);

    // Formally set default PSKc
    ctx.mConf.mPSKc = {'1', '0'};

    using namespace ot::commissioner::persistent_storage;
    // Prepare test data
    NetworkId      nid;
    BorderRouterId rid;

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan1", 1, 1, 0x1, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan2", 2, 2, 0x2, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20002, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan3", 3, 3, 0x3, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 2);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20003, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 2);

    Init(ctx, ".");

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[3] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};

    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .Times(3)
        .WillRepeatedly(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[0], IsActive()).WillOnce(Return(false)).WillRepeatedly(Return(true));
    EXPECT_CALL(*commissionerAppMocks[1], IsActive()).WillOnce(Return(false)).WillRepeatedly(Return(true));
    EXPECT_CALL(*commissionerAppMocks[2], IsActive()).WillRepeatedly(Return(false));

    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"start"}, {0x1, 0x02, 0x03}, false).mCode, ErrorCode::kNone);

    EXPECT_CALL(*commissionerAppMocks[0], Start(_, _, _)).Times(1).WillOnce(Return(Error{}));
    EXPECT_CALL(*commissionerAppMocks[1], Start(_, _, _)).Times(1).WillOnce(Return(Error{}));
    EXPECT_CALL(*commissionerAppMocks[2], Start(_, _, _))
        .Times(1)
        .WillOnce(Return(Error{ErrorCode::kAborted, "Aborted"}));

    ctx.mJobManager.RunJobs();

    Interpreter::Value value = ctx.mJobManager.CollectJobsValue();
    nlohmann::json     json  = nlohmann::json::parse(value.ToString());

    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_FALSE(json.contains("0x0000000000000003"));
    ctx.mJobManager.CleanupJobs();

    // "active" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"active"}, {0x1, 0x2, 0x3}, false).mCode, ErrorCode::kNone);
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json.contains("0x0000000000000003"));
    EXPECT_TRUE(json["0x0000000000000001"]);
    EXPECT_TRUE(json["0x0000000000000002"]);
    EXPECT_FALSE(json["0x0000000000000003"]);
    ctx.mJobManager.CleanupJobs();

    // "sessionid" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"sessionid"}, {0x1, 0x2}, false).mCode, ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], GetSessionId(_))
        .WillOnce(DoAll(WithArg<0>([](uint16_t &a) { a = 0; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[1], GetSessionId(_))
        .WillOnce(DoAll(WithArg<0>([](uint16_t &a) { a = 1; }), Return(Error{})));
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_EQ(json["0x0000000000000001"], 0);
    EXPECT_EQ(json["0x0000000000000002"], 1);
    ctx.mJobManager.CleanupJobs();

    // "opdataset get active" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"opdataset", "get", "active"}, {0x1, 0x2}, false).mCode, ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], GetActiveDataset(_, _))
        .WillOnce(DoAll(WithArgs<0>([](ActiveOperationalDataset &ods) {
                            ods.mPanId        = 1;
                            ods.mPresentFlags = ActiveOperationalDataset::kPanIdBit;
                        }),
                        Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[1], GetActiveDataset(_, _))
        .WillOnce(DoAll(WithArgs<0>([](ActiveOperationalDataset &ods) {
                            ods.mPanId        = 2;
                            ods.mPresentFlags = ActiveOperationalDataset::kPanIdBit;
                        }),
                        Return(Error{})));
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json["0x0000000000000001"].contains("PanId"));
    EXPECT_TRUE(json["0x0000000000000002"].contains("PanId"));
    EXPECT_STREQ("0x0001", json["0x0000000000000001"]["PanId"].get<std::string>().c_str());
    EXPECT_STREQ("0x0002", json["0x0000000000000002"]["PanId"].get<std::string>().c_str());
    ctx.mJobManager.CleanupJobs();

    // "opdataset set securitypolicy" command
    SecurityPolicy policies[2];
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"opdataset", "set", "securitypolicy", "3", "AB"}, {0x1, 0x2}, false).mCode,
              ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], SetSecurityPolicy(_))
        .WillOnce(DoAll(WithArgs<0>([&policies](const SecurityPolicy &pol) { policies[0] = pol; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[1], SetSecurityPolicy(_))
        .WillOnce(DoAll(WithArgs<0>([&policies](const SecurityPolicy &pol) { policies[1] = pol; }), Return(Error{})));
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json["0x0000000000000001"]);
    EXPECT_TRUE(json["0x0000000000000002"]);
    ctx.mJobManager.CleanupJobs();

    // "stop" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"stop"}, {0x1, 0x2}, false).mCode, ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], Stop());
    EXPECT_CALL(*commissionerAppMocks[1], Stop());
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json["0x0000000000000001"]);
    EXPECT_TRUE(json["0x0000000000000002"]);
    ctx.mJobManager.CleanupJobs();
}